

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx512::CurveNiMBIntersectorK<8,4>::
     intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  int iVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  byte bVar33;
  uint uVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar38;
  uint uVar39;
  long lVar40;
  ulong uVar41;
  uint uVar42;
  uint uVar43;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  ulong uVar44;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  int iVar104;
  float t1;
  float fVar105;
  undefined4 uVar106;
  float fVar109;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar110;
  float fVar111;
  float fVar112;
  vfloat4 a0_1;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  vfloat4 a0_2;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar142;
  float fVar143;
  vfloat4 a0;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar144;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  vfloat4 b0;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  __m128 a_1;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  __m128 a;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar176;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [32];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  float fVar213;
  float fVar214;
  vfloat4 a0_3;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  float fVar215;
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar217;
  vfloat4 b0_2;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  vfloat4 a0_4;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  float fVar250;
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar254;
  undefined1 auVar253 [32];
  int iVar255;
  undefined1 in_ZMM17 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_498 [8];
  float fStack_490;
  float fStack_48c;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  ulong local_398;
  Primitive *local_390;
  RTCFilterFunctionNArguments local_388;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  uint auStack_308 [4];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint uStack_168;
  float afStack_164 [7];
  RTCHitN local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar37;
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  undefined1 auVar103 [32];
  undefined1 auVar242 [32];
  
  PVar5 = prim[1];
  uVar35 = (ulong)(byte)PVar5;
  lVar40 = uVar35 * 0x25;
  fVar132 = *(float *)(prim + lVar40 + 0x12);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar46 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar65 = vinsertps_avx(auVar46,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar66 = vsubps_avx(auVar45,*(undefined1 (*) [16])(prim + lVar40 + 6));
  fVar131 = fVar132 * auVar66._0_4_;
  fVar105 = fVar132 * auVar65._0_4_;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + uVar35 * 4 + 6);
  auVar75 = vpmovsxbd_avx2(auVar45);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar35 * 5 + 6);
  auVar74 = vpmovsxbd_avx2(auVar46);
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = *(ulong *)(prim + uVar35 * 6 + 6);
  auVar86 = vpmovsxbd_avx2(auVar61);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar57._8_8_ = 0;
  auVar57._0_8_ = *(ulong *)(prim + uVar35 * 0xf + 6);
  auVar87 = vpmovsxbd_avx2(auVar57);
  auVar60._8_8_ = 0;
  auVar60._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar80 = vpmovsxbd_avx2(auVar60);
  auVar87 = vcvtdq2ps_avx(auVar87);
  auVar88 = vcvtdq2ps_avx(auVar80);
  auVar62._8_8_ = 0;
  auVar62._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar35 + 6);
  auVar76 = vpmovsxbd_avx2(auVar62);
  auVar76 = vcvtdq2ps_avx(auVar76);
  auVar58._8_8_ = 0;
  auVar58._0_8_ = *(ulong *)(prim + uVar35 * 0x1a + 6);
  auVar77 = vpmovsxbd_avx2(auVar58);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar59._8_8_ = 0;
  auVar59._0_8_ = *(ulong *)(prim + uVar35 * 0x1b + 6);
  auVar78 = vpmovsxbd_avx2(auVar59);
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar64._8_8_ = 0;
  auVar64._0_8_ = *(ulong *)(prim + uVar35 * 0x1c + 6);
  auVar73 = vpmovsxbd_avx2(auVar64);
  auVar79 = vcvtdq2ps_avx(auVar73);
  auVar90._4_4_ = fVar105;
  auVar90._0_4_ = fVar105;
  auVar90._8_4_ = fVar105;
  auVar90._12_4_ = fVar105;
  auVar90._16_4_ = fVar105;
  auVar90._20_4_ = fVar105;
  auVar90._24_4_ = fVar105;
  auVar90._28_4_ = fVar105;
  auVar253._8_4_ = 1;
  auVar253._0_8_ = 0x100000001;
  auVar253._12_4_ = 1;
  auVar253._16_4_ = 1;
  auVar253._20_4_ = 1;
  auVar253._24_4_ = 1;
  auVar253._28_4_ = 1;
  auVar71 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar82 = ZEXT1632(CONCAT412(fVar132 * auVar65._12_4_,
                               CONCAT48(fVar132 * auVar65._8_4_,
                                        CONCAT44(fVar132 * auVar65._4_4_,fVar105))));
  auVar81 = vpermps_avx2(auVar253,auVar82);
  auVar72 = vpermps_avx512vl(auVar71,auVar82);
  fVar199 = auVar72._0_4_;
  fVar213 = auVar72._4_4_;
  auVar82._4_4_ = fVar213 * auVar86._4_4_;
  auVar82._0_4_ = fVar199 * auVar86._0_4_;
  fVar214 = auVar72._8_4_;
  auVar82._8_4_ = fVar214 * auVar86._8_4_;
  fVar109 = auVar72._12_4_;
  auVar82._12_4_ = fVar109 * auVar86._12_4_;
  fVar110 = auVar72._16_4_;
  auVar82._16_4_ = fVar110 * auVar86._16_4_;
  fVar111 = auVar72._20_4_;
  auVar82._20_4_ = fVar111 * auVar86._20_4_;
  fVar112 = auVar72._24_4_;
  auVar82._24_4_ = fVar112 * auVar86._24_4_;
  auVar82._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar76._4_4_ * fVar213;
  auVar80._0_4_ = auVar76._0_4_ * fVar199;
  auVar80._8_4_ = auVar76._8_4_ * fVar214;
  auVar80._12_4_ = auVar76._12_4_ * fVar109;
  auVar80._16_4_ = auVar76._16_4_ * fVar110;
  auVar80._20_4_ = auVar76._20_4_ * fVar111;
  auVar80._24_4_ = auVar76._24_4_ * fVar112;
  auVar80._28_4_ = auVar73._28_4_;
  auVar73._4_4_ = auVar79._4_4_ * fVar213;
  auVar73._0_4_ = auVar79._0_4_ * fVar199;
  auVar73._8_4_ = auVar79._8_4_ * fVar214;
  auVar73._12_4_ = auVar79._12_4_ * fVar109;
  auVar73._16_4_ = auVar79._16_4_ * fVar110;
  auVar73._20_4_ = auVar79._20_4_ * fVar111;
  auVar73._24_4_ = auVar79._24_4_ * fVar112;
  auVar73._28_4_ = auVar72._28_4_;
  auVar45 = vfmadd231ps_fma(auVar82,auVar81,auVar74);
  auVar46 = vfmadd231ps_fma(auVar80,auVar81,auVar88);
  auVar61 = vfmadd231ps_fma(auVar73,auVar78,auVar81);
  auVar45 = vfmadd231ps_fma(ZEXT1632(auVar45),auVar90,auVar75);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar90,auVar87);
  auVar61 = vfmadd231ps_fma(ZEXT1632(auVar61),auVar77,auVar90);
  auVar249._4_4_ = fVar131;
  auVar249._0_4_ = fVar131;
  auVar249._8_4_ = fVar131;
  auVar249._12_4_ = fVar131;
  auVar249._16_4_ = fVar131;
  auVar249._20_4_ = fVar131;
  auVar249._24_4_ = fVar131;
  auVar249._28_4_ = fVar131;
  auVar73 = ZEXT1632(CONCAT412(fVar132 * auVar66._12_4_,
                               CONCAT48(fVar132 * auVar66._8_4_,
                                        CONCAT44(fVar132 * auVar66._4_4_,fVar131))));
  auVar80 = vpermps_avx2(auVar253,auVar73);
  auVar73 = vpermps_avx512vl(auVar71,auVar73);
  fVar132 = auVar73._0_4_;
  fVar199 = auVar73._4_4_;
  auVar81._4_4_ = fVar199 * auVar86._4_4_;
  auVar81._0_4_ = fVar132 * auVar86._0_4_;
  fVar213 = auVar73._8_4_;
  auVar81._8_4_ = fVar213 * auVar86._8_4_;
  fVar214 = auVar73._12_4_;
  auVar81._12_4_ = fVar214 * auVar86._12_4_;
  fVar109 = auVar73._16_4_;
  auVar81._16_4_ = fVar109 * auVar86._16_4_;
  fVar110 = auVar73._20_4_;
  auVar81._20_4_ = fVar110 * auVar86._20_4_;
  fVar111 = auVar73._24_4_;
  auVar81._24_4_ = fVar111 * auVar86._24_4_;
  auVar81._28_4_ = fVar105;
  auVar71._4_4_ = auVar76._4_4_ * fVar199;
  auVar71._0_4_ = auVar76._0_4_ * fVar132;
  auVar71._8_4_ = auVar76._8_4_ * fVar213;
  auVar71._12_4_ = auVar76._12_4_ * fVar214;
  auVar71._16_4_ = auVar76._16_4_ * fVar109;
  auVar71._20_4_ = auVar76._20_4_ * fVar110;
  auVar71._24_4_ = auVar76._24_4_ * fVar111;
  auVar71._28_4_ = auVar86._28_4_;
  auVar76._4_4_ = auVar79._4_4_ * fVar199;
  auVar76._0_4_ = auVar79._0_4_ * fVar132;
  auVar76._8_4_ = auVar79._8_4_ * fVar213;
  auVar76._12_4_ = auVar79._12_4_ * fVar214;
  auVar76._16_4_ = auVar79._16_4_ * fVar109;
  auVar76._20_4_ = auVar79._20_4_ * fVar110;
  auVar76._24_4_ = auVar79._24_4_ * fVar111;
  auVar76._28_4_ = auVar73._28_4_;
  auVar57 = vfmadd231ps_fma(auVar81,auVar80,auVar74);
  auVar60 = vfmadd231ps_fma(auVar71,auVar80,auVar88);
  auVar62 = vfmadd231ps_fma(auVar76,auVar80,auVar78);
  auVar65 = vfmadd231ps_fma(ZEXT1632(auVar57),auVar249,auVar75);
  auVar66 = vfmadd231ps_fma(ZEXT1632(auVar60),auVar249,auVar87);
  auVar91._8_4_ = 0x7fffffff;
  auVar91._0_8_ = 0x7fffffff7fffffff;
  auVar91._12_4_ = 0x7fffffff;
  auVar91._16_4_ = 0x7fffffff;
  auVar91._20_4_ = 0x7fffffff;
  auVar91._24_4_ = 0x7fffffff;
  auVar91._28_4_ = 0x7fffffff;
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar62),auVar249,auVar77);
  auVar75 = vandps_avx(ZEXT1632(auVar45),auVar91);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar191._16_4_ = 0x219392ef;
  auVar191._20_4_ = 0x219392ef;
  auVar191._24_4_ = 0x219392ef;
  auVar191._28_4_ = 0x219392ef;
  uVar41 = vcmpps_avx512vl(auVar75,auVar191,1);
  bVar15 = (bool)((byte)uVar41 & 1);
  auVar72._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar45._0_4_;
  bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar45._4_4_;
  bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar45._8_4_;
  bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar45._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar46),auVar91);
  uVar41 = vcmpps_avx512vl(auVar75,auVar191,1);
  bVar15 = (bool)((byte)uVar41 & 1);
  auVar83._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar46._0_4_;
  bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar83._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar46._4_4_;
  bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar83._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar46._8_4_;
  bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar83._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar46._12_4_;
  auVar83._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar83._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar83._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar83._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar75 = vandps_avx(ZEXT1632(auVar61),auVar91);
  uVar41 = vcmpps_avx512vl(auVar75,auVar191,1);
  bVar15 = (bool)((byte)uVar41 & 1);
  auVar75._0_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar61._0_4_;
  bVar15 = (bool)((byte)(uVar41 >> 1) & 1);
  auVar75._4_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar61._4_4_;
  bVar15 = (bool)((byte)(uVar41 >> 2) & 1);
  auVar75._8_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar61._8_4_;
  bVar15 = (bool)((byte)(uVar41 >> 3) & 1);
  auVar75._12_4_ = (uint)bVar15 * 0x219392ef | (uint)!bVar15 * auVar61._12_4_;
  auVar75._16_4_ = (uint)((byte)(uVar41 >> 4) & 1) * 0x219392ef;
  auVar75._20_4_ = (uint)((byte)(uVar41 >> 5) & 1) * 0x219392ef;
  auVar75._24_4_ = (uint)((byte)(uVar41 >> 6) & 1) * 0x219392ef;
  auVar75._28_4_ = (uint)(byte)(uVar41 >> 7) * 0x219392ef;
  auVar74 = vrcp14ps_avx512vl(auVar72);
  auVar150._8_4_ = 0x3f800000;
  auVar150._0_8_ = &DAT_3f8000003f800000;
  auVar150._12_4_ = 0x3f800000;
  auVar150._16_4_ = 0x3f800000;
  auVar150._20_4_ = 0x3f800000;
  auVar150._24_4_ = 0x3f800000;
  auVar150._28_4_ = 0x3f800000;
  auVar45 = vfnmadd213ps_fma(auVar72,auVar74,auVar150);
  auVar45 = vfmadd132ps_fma(ZEXT1632(auVar45),auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar83);
  auVar46 = vfnmadd213ps_fma(auVar83,auVar74,auVar150);
  auVar46 = vfmadd132ps_fma(ZEXT1632(auVar46),auVar74,auVar74);
  auVar74 = vrcp14ps_avx512vl(auVar75);
  auVar61 = vfnmadd213ps_fma(auVar75,auVar74,auVar150);
  auVar61 = vfmadd132ps_fma(ZEXT1632(auVar61),auVar74,auVar74);
  fVar132 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar40 + 0x16)) *
            *(float *)(prim + lVar40 + 0x1a);
  auVar139._4_4_ = fVar132;
  auVar139._0_4_ = fVar132;
  auVar139._8_4_ = fVar132;
  auVar139._12_4_ = fVar132;
  auVar139._16_4_ = fVar132;
  auVar139._20_4_ = fVar132;
  auVar139._24_4_ = fVar132;
  auVar139._28_4_ = fVar132;
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 7 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0xb + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar86 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 9 + 6));
  auVar57 = vfmadd213ps_fma(auVar74,auVar139,auVar75);
  auVar75 = vcvtdq2ps_avx(auVar86);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0xd + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar60 = vfmadd213ps_fma(auVar74,auVar139,auVar75);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x12 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  uVar41 = (ulong)(uint)((int)(uVar35 * 5) << 2);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 2 + uVar41 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar62 = vfmadd213ps_fma(auVar74,auVar139,auVar75);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar41 + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x18 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar58 = vfmadd213ps_fma(auVar74,auVar139,auVar75);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x1d + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 + (ulong)(byte)PVar5 * 0x20 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar59 = vfmadd213ps_fma(auVar74,auVar139,auVar75);
  auVar75 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar5 * 0x20 - uVar35) + 6));
  auVar75 = vcvtdq2ps_avx(auVar75);
  auVar74 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar35 * 0x23 + 6));
  auVar74 = vcvtdq2ps_avx(auVar74);
  auVar74 = vsubps_avx(auVar74,auVar75);
  auVar64 = vfmadd213ps_fma(auVar74,auVar139,auVar75);
  auVar75 = vsubps_avx(ZEXT1632(auVar57),ZEXT1632(auVar65));
  auVar77._4_4_ = auVar45._4_4_ * auVar75._4_4_;
  auVar77._0_4_ = auVar45._0_4_ * auVar75._0_4_;
  auVar77._8_4_ = auVar45._8_4_ * auVar75._8_4_;
  auVar77._12_4_ = auVar45._12_4_ * auVar75._12_4_;
  auVar77._16_4_ = auVar75._16_4_ * 0.0;
  auVar77._20_4_ = auVar75._20_4_ * 0.0;
  auVar77._24_4_ = auVar75._24_4_ * 0.0;
  auVar77._28_4_ = auVar75._28_4_;
  auVar75 = vsubps_avx(ZEXT1632(auVar60),ZEXT1632(auVar65));
  auVar89._0_4_ = auVar45._0_4_ * auVar75._0_4_;
  auVar89._4_4_ = auVar45._4_4_ * auVar75._4_4_;
  auVar89._8_4_ = auVar45._8_4_ * auVar75._8_4_;
  auVar89._12_4_ = auVar45._12_4_ * auVar75._12_4_;
  auVar89._16_4_ = auVar75._16_4_ * 0.0;
  auVar89._20_4_ = auVar75._20_4_ * 0.0;
  auVar89._24_4_ = auVar75._24_4_ * 0.0;
  auVar89._28_4_ = 0;
  auVar75 = vsubps_avx(ZEXT1632(auVar62),ZEXT1632(auVar66));
  auVar78._4_4_ = auVar46._4_4_ * auVar75._4_4_;
  auVar78._0_4_ = auVar46._0_4_ * auVar75._0_4_;
  auVar78._8_4_ = auVar46._8_4_ * auVar75._8_4_;
  auVar78._12_4_ = auVar46._12_4_ * auVar75._12_4_;
  auVar78._16_4_ = auVar75._16_4_ * 0.0;
  auVar78._20_4_ = auVar75._20_4_ * 0.0;
  auVar78._24_4_ = auVar75._24_4_ * 0.0;
  auVar78._28_4_ = auVar75._28_4_;
  auVar75 = vsubps_avx(ZEXT1632(auVar58),ZEXT1632(auVar66));
  auVar85._0_4_ = auVar46._0_4_ * auVar75._0_4_;
  auVar85._4_4_ = auVar46._4_4_ * auVar75._4_4_;
  auVar85._8_4_ = auVar46._8_4_ * auVar75._8_4_;
  auVar85._12_4_ = auVar46._12_4_ * auVar75._12_4_;
  auVar85._16_4_ = auVar75._16_4_ * 0.0;
  auVar85._20_4_ = auVar75._20_4_ * 0.0;
  auVar85._24_4_ = auVar75._24_4_ * 0.0;
  auVar85._28_4_ = 0;
  auVar75 = vsubps_avx(ZEXT1632(auVar59),ZEXT1632(auVar113));
  auVar79._4_4_ = auVar61._4_4_ * auVar75._4_4_;
  auVar79._0_4_ = auVar61._0_4_ * auVar75._0_4_;
  auVar79._8_4_ = auVar61._8_4_ * auVar75._8_4_;
  auVar79._12_4_ = auVar61._12_4_ * auVar75._12_4_;
  auVar79._16_4_ = auVar75._16_4_ * 0.0;
  auVar79._20_4_ = auVar75._20_4_ * 0.0;
  auVar79._24_4_ = auVar75._24_4_ * 0.0;
  auVar79._28_4_ = auVar75._28_4_;
  auVar75 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar113));
  auVar84._0_4_ = auVar61._0_4_ * auVar75._0_4_;
  auVar84._4_4_ = auVar61._4_4_ * auVar75._4_4_;
  auVar84._8_4_ = auVar61._8_4_ * auVar75._8_4_;
  auVar84._12_4_ = auVar61._12_4_ * auVar75._12_4_;
  auVar84._16_4_ = auVar75._16_4_ * 0.0;
  auVar84._20_4_ = auVar75._20_4_ * 0.0;
  auVar84._24_4_ = auVar75._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar75 = vpminsd_avx2(auVar77,auVar89);
  auVar74 = vpminsd_avx2(auVar78,auVar85);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74 = vpminsd_avx2(auVar79,auVar84);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar86._4_4_ = uVar106;
  auVar86._0_4_ = uVar106;
  auVar86._8_4_ = uVar106;
  auVar86._12_4_ = uVar106;
  auVar86._16_4_ = uVar106;
  auVar86._20_4_ = uVar106;
  auVar86._24_4_ = uVar106;
  auVar86._28_4_ = uVar106;
  auVar74 = vmaxps_avx512vl(auVar74,auVar86);
  auVar75 = vmaxps_avx(auVar75,auVar74);
  auVar74._8_4_ = 0x3f7ffffa;
  auVar74._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar74._12_4_ = 0x3f7ffffa;
  auVar74._16_4_ = 0x3f7ffffa;
  auVar74._20_4_ = 0x3f7ffffa;
  auVar74._24_4_ = 0x3f7ffffa;
  auVar74._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar75,auVar74);
  auVar75 = vpmaxsd_avx2(auVar77,auVar89);
  auVar74 = vpmaxsd_avx2(auVar78,auVar85);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar74 = vpmaxsd_avx2(auVar79,auVar84);
  uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar87._4_4_ = uVar106;
  auVar87._0_4_ = uVar106;
  auVar87._8_4_ = uVar106;
  auVar87._12_4_ = uVar106;
  auVar87._16_4_ = uVar106;
  auVar87._20_4_ = uVar106;
  auVar87._24_4_ = uVar106;
  auVar87._28_4_ = uVar106;
  auVar74 = vminps_avx512vl(auVar74,auVar87);
  auVar75 = vminps_avx(auVar75,auVar74);
  auVar88._8_4_ = 0x3f800003;
  auVar88._0_8_ = 0x3f8000033f800003;
  auVar88._12_4_ = 0x3f800003;
  auVar88._16_4_ = 0x3f800003;
  auVar88._20_4_ = 0x3f800003;
  auVar88._24_4_ = 0x3f800003;
  auVar88._28_4_ = 0x3f800003;
  auVar75 = vmulps_avx512vl(auVar75,auVar88);
  auVar74 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar74,_DAT_0205a920);
  uVar17 = vcmpps_avx512vl(local_b8,auVar75,2);
  if ((byte)((byte)uVar17 & (byte)uVar18) == 0) {
    return;
  }
  uVar41 = (ulong)(byte)((byte)uVar17 & (byte)uVar18);
  local_2f8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar45 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar256 = ZEXT1664(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
  auVar261 = ZEXT1664(auVar45);
  local_390 = prim;
LAB_01ebc72b:
  lVar40 = 0;
  for (uVar35 = uVar41; (uVar35 & 1) == 0; uVar35 = uVar35 >> 1 | 0x8000000000000000) {
    lVar40 = lVar40 + 1;
  }
  uVar42 = *(uint *)(local_390 + 2);
  pGVar7 = (context->scene->geometries).items[uVar42].ptr;
  fVar132 = (pGVar7->time_range).lower;
  fVar132 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar132) / ((pGVar7->time_range).upper - fVar132));
  auVar45 = vroundss_avx(ZEXT416((uint)fVar132),ZEXT416((uint)fVar132),9);
  uVar35 = (ulong)*(uint *)(local_390 + lVar40 * 4 + 6);
  auVar46 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar45 = vminss_avx(auVar45,auVar46);
  auVar47 = vmaxss_avx512f(auVar256._0_16_,auVar45);
  uVar36 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           uVar35 * pGVar7[1].super_RefCount.refCounter.
                                    super___atomic_base<unsigned_long>._M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar38 = (long)(int)auVar47._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar38);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar38);
  auVar45 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar36);
  lVar40 = uVar36 + 1;
  auVar46 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar40);
  lVar1 = uVar36 + 2;
  auVar61 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar2 = uVar36 + 3;
  auVar57 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar2);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar38);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar38);
  auVar60 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar36);
  auVar62 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar40);
  auVar58 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar59 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar38);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar38);
  auVar64 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar36);
  auVar65 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar40);
  auVar66 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  auVar113 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar2);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar38);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar38);
  auVar114 = *(undefined1 (*) [16])(lVar10 + uVar36 * lVar9);
  auVar123 = *(undefined1 (*) [16])(lVar10 + lVar40 * lVar9);
  auVar67 = *(undefined1 (*) [16])(lVar10 + lVar1 * lVar9);
  auVar48 = vsubss_avx512f(ZEXT416((uint)fVar132),auVar47);
  auVar107._0_12_ = ZEXT812(0);
  auVar107._12_4_ = 0;
  auVar47 = vmulps_avx512vl(auVar57,auVar107);
  auVar49 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaab));
  auVar50 = vfmadd213ps_avx512vl(auVar49,auVar61,auVar47);
  auVar51 = vbroadcastss_avx512vl(ZEXT416(0x3f2aaaab));
  auVar50 = vfmadd231ps_avx512vl(auVar50,auVar46,auVar51);
  auVar52 = vfmadd231ps_avx512vl(auVar50,auVar45,auVar49);
  auVar68 = auVar261._0_16_;
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar61,auVar68);
  auVar47 = vfnmadd231ps_avx512vl(auVar47,auVar46,auVar107);
  auVar53 = vfnmadd231ps_avx512vl(auVar47,auVar45,auVar68);
  auVar55._0_4_ = auVar59._0_4_ * 0.0;
  auVar55._4_4_ = auVar59._4_4_ * 0.0;
  auVar55._8_4_ = auVar59._8_4_ * 0.0;
  auVar55._12_4_ = auVar59._12_4_ * 0.0;
  auVar47 = vfmadd213ps_avx512vl(auVar49,auVar58,auVar55);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar62,auVar51);
  auVar54 = vfmadd231ps_avx512vl(auVar47,auVar60,auVar49);
  auVar47 = vfmadd231ps_avx512vl(auVar55,auVar58,auVar68);
  auVar47 = vfnmadd231ps_fma(auVar47,auVar62,auVar107);
  auVar55 = vfnmadd231ps_avx512vl(auVar47,auVar60,auVar68);
  auVar47 = vmulps_avx512vl(auVar57,auVar49);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar61,auVar51);
  auVar47 = vfmadd231ps_avx512vl(auVar47,auVar46,auVar49);
  auVar56 = vfmadd231ps_avx512vl(auVar47,auVar45,auVar107);
  auVar57 = vmulps_avx512vl(auVar57,auVar68);
  auVar61 = vfmadd231ps_fma(auVar57,auVar107,auVar61);
  auVar46 = vfnmadd231ps_avx512vl(auVar61,auVar68,auVar46);
  auVar50 = vfnmadd231ps_fma(auVar46,auVar107,auVar45);
  auVar45 = vmulps_avx512vl(auVar59,auVar49);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar58,auVar51);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar62,auVar49);
  auVar47 = vfmadd231ps_fma(auVar45,auVar60,auVar107);
  auVar45 = vmulps_avx512vl(auVar59,auVar68);
  auVar45 = vfmadd231ps_fma(auVar45,auVar107,auVar58);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar68,auVar62);
  auVar62 = vfnmadd231ps_fma(auVar45,auVar107,auVar60);
  auVar46 = vshufps_avx512vl(auVar53,auVar53,0xc9);
  auVar45 = vshufps_avx512vl(auVar54,auVar54,0xc9);
  auVar45 = vmulps_avx512vl(auVar53,auVar45);
  auVar45 = vfmsub231ps_avx512vl(auVar45,auVar46,auVar54);
  auVar61 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar55,auVar55,0xc9);
  auVar45 = vmulps_avx512vl(auVar53,auVar45);
  auVar45 = vfmsub231ps_fma(auVar45,auVar46,auVar55);
  auVar57 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vshufps_avx(auVar50,auVar50,0xc9);
  auVar46 = vshufps_avx(auVar47,auVar47,0xc9);
  auVar69._0_4_ = auVar50._0_4_ * auVar46._0_4_;
  auVar69._4_4_ = auVar50._4_4_ * auVar46._4_4_;
  auVar69._8_4_ = auVar50._8_4_ * auVar46._8_4_;
  auVar69._12_4_ = auVar50._12_4_ * auVar46._12_4_;
  auVar46 = vfmsub231ps_fma(auVar69,auVar45,auVar47);
  auVar60 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar158._0_4_ = auVar50._0_4_ * auVar46._0_4_;
  auVar158._4_4_ = auVar50._4_4_ * auVar46._4_4_;
  auVar158._8_4_ = auVar50._8_4_ * auVar46._8_4_;
  auVar158._12_4_ = auVar50._12_4_ * auVar46._12_4_;
  auVar45 = vfmsub231ps_fma(auVar158,auVar45,auVar62);
  auVar62 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar45 = vdpps_avx(auVar61,auVar61,0x7f);
  auVar46 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar58 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar45,ZEXT416(0xbf000000));
  auVar59 = vmulss_avx512f(auVar59,auVar46);
  auVar46 = vmulss_avx512f(auVar59,ZEXT416((uint)(auVar46._0_4_ * auVar46._0_4_)));
  fVar132 = auVar58._0_4_ + auVar46._0_4_;
  auVar177._4_4_ = fVar132;
  auVar177._0_4_ = fVar132;
  auVar177._8_4_ = fVar132;
  auVar177._12_4_ = fVar132;
  auVar46 = vdpps_avx(auVar61,auVar57,0x7f);
  auVar58 = vmulps_avx512vl(auVar61,auVar177);
  auVar59 = vbroadcastss_avx512vl(auVar45);
  auVar57 = vmulps_avx512vl(auVar59,auVar57);
  fVar105 = auVar46._0_4_;
  auVar63._0_4_ = fVar105 * auVar61._0_4_;
  auVar63._4_4_ = fVar105 * auVar61._4_4_;
  auVar63._8_4_ = fVar105 * auVar61._8_4_;
  auVar63._12_4_ = fVar105 * auVar61._12_4_;
  auVar61 = vsubps_avx(auVar57,auVar63);
  auVar46 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar46,ZEXT416(0x40000000));
  fVar199 = auVar46._0_4_ * auVar45._0_4_;
  auVar45 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar46 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar57 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar59 = vmulss_avx512f(auVar45,ZEXT416(0xbf000000));
  fVar105 = auVar46._0_4_;
  fVar105 = auVar57._0_4_ + auVar59._0_4_ * fVar105 * fVar105 * fVar105;
  auVar178._0_4_ = auVar60._0_4_ * fVar105;
  auVar178._4_4_ = auVar60._4_4_ * fVar105;
  auVar178._8_4_ = auVar60._8_4_ * fVar105;
  auVar178._12_4_ = auVar60._12_4_ * fVar105;
  auVar46 = vdpps_avx(auVar60,auVar62,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar45);
  auVar57 = vmulps_avx512vl(auVar57,auVar62);
  fVar213 = auVar46._0_4_;
  auVar47._0_4_ = fVar213 * auVar60._0_4_;
  auVar47._4_4_ = fVar213 * auVar60._4_4_;
  auVar47._8_4_ = fVar213 * auVar60._8_4_;
  auVar47._12_4_ = fVar213 * auVar60._12_4_;
  auVar46 = vsubps_avx(auVar57,auVar47);
  auVar57 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar57,ZEXT416(0x40000000));
  fVar213 = auVar57._0_4_ * auVar45._0_4_;
  auVar45 = vshufps_avx512vl(auVar52,auVar52,0xff);
  auVar57 = vmulps_avx512vl(auVar45,auVar58);
  auVar59 = vsubps_avx512vl(auVar52,auVar57);
  auVar60 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar60 = vmulps_avx512vl(auVar60,auVar58);
  auVar54._0_4_ = auVar60._0_4_ + auVar45._0_4_ * fVar132 * fVar199 * auVar61._0_4_;
  auVar54._4_4_ = auVar60._4_4_ + auVar45._4_4_ * fVar132 * fVar199 * auVar61._4_4_;
  auVar54._8_4_ = auVar60._8_4_ + auVar45._8_4_ * fVar132 * fVar199 * auVar61._8_4_;
  auVar54._12_4_ = auVar60._12_4_ + auVar45._12_4_ * fVar132 * fVar199 * auVar61._12_4_;
  auVar61 = vsubps_avx512vl(auVar53,auVar54);
  auVar47 = vaddps_avx512vl(auVar52,auVar57);
  auVar57 = vaddps_avx512vl(auVar53,auVar54);
  auVar45 = vshufps_avx512vl(auVar56,auVar56,0xff);
  auVar60 = vmulps_avx512vl(auVar45,auVar178);
  auVar52 = vsubps_avx512vl(auVar56,auVar60);
  auVar62 = vshufps_avx512vl(auVar50,auVar50,0xff);
  auVar62 = vmulps_avx512vl(auVar62,auVar178);
  auVar179._0_4_ = auVar62._0_4_ + auVar45._0_4_ * fVar105 * auVar46._0_4_ * fVar213;
  auVar179._4_4_ = auVar62._4_4_ + auVar45._4_4_ * fVar105 * auVar46._4_4_ * fVar213;
  auVar179._8_4_ = auVar62._8_4_ + auVar45._8_4_ * fVar105 * auVar46._8_4_ * fVar213;
  auVar179._12_4_ = auVar62._12_4_ + auVar45._12_4_ * fVar105 * auVar46._12_4_ * fVar213;
  auVar45 = vsubps_avx(auVar50,auVar179);
  auVar53 = vaddps_avx512vl(auVar56,auVar60);
  auVar46 = vaddps_avx512vl(auVar50,auVar179);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
  auVar61 = vmulps_avx512vl(auVar61,auVar50);
  auVar164._0_4_ = auVar59._0_4_ + auVar61._0_4_;
  auVar164._4_4_ = auVar59._4_4_ + auVar61._4_4_;
  auVar164._8_4_ = auVar59._8_4_ + auVar61._8_4_;
  auVar164._12_4_ = auVar59._12_4_ + auVar61._12_4_;
  auVar45 = vmulps_avx512vl(auVar45,auVar50);
  auVar58 = vsubps_avx(auVar52,auVar45);
  auVar45 = vmulps_avx512vl(auVar57,auVar50);
  local_498._4_4_ = auVar47._4_4_ + auVar45._4_4_;
  local_498._0_4_ = auVar47._0_4_ + auVar45._0_4_;
  fStack_490 = auVar47._8_4_ + auVar45._8_4_;
  fStack_48c = auVar47._12_4_ + auVar45._12_4_;
  auVar45 = vmulps_avx512vl(auVar46,auVar50);
  auVar54 = vsubps_avx512vl(auVar53,auVar45);
  auVar45 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar2);
  auVar46 = vmulps_avx512vl(auVar113,auVar107);
  auVar61 = vfmadd213ps_avx512vl(auVar49,auVar66,auVar46);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar65,auVar51);
  auVar55 = vfmadd231ps_avx512vl(auVar61,auVar64,auVar49);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar66,auVar68);
  auVar46 = vfnmadd231ps_fma(auVar46,auVar65,auVar107);
  auVar56 = vfnmadd231ps_avx512vl(auVar46,auVar64,auVar68);
  auVar46 = vmulps_avx512vl(auVar45,auVar107);
  auVar61 = vfmadd213ps_avx512vl(auVar49,auVar67,auVar46);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar123,auVar51);
  auVar61 = vfmadd231ps_avx512vl(auVar61,auVar114,auVar49);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar67,auVar68);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar123,auVar107);
  auVar57 = vfnmadd231ps_avx512vl(auVar46,auVar114,auVar68);
  auVar46 = vmulps_avx512vl(auVar113,auVar49);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar66,auVar51);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar65,auVar49);
  auVar63 = vfmadd231ps_avx512vl(auVar46,auVar64,auVar107);
  auVar46 = vmulps_avx512vl(auVar113,auVar68);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar107,auVar66);
  auVar46 = vfnmadd231ps_avx512vl(auVar46,auVar68,auVar65);
  auVar64 = vfnmadd231ps_avx512vl(auVar46,auVar107,auVar64);
  auVar46 = vmulps_avx512vl(auVar45,auVar49);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar67,auVar51);
  auVar46 = vfmadd231ps_avx512vl(auVar46,auVar123,auVar49);
  auVar46 = vfmadd231ps_fma(auVar46,auVar114,auVar107);
  auVar45 = vmulps_avx512vl(auVar45,auVar68);
  auVar45 = vfmadd231ps_fma(auVar45,auVar107,auVar67);
  auVar45 = vfnmadd231ps_avx512vl(auVar45,auVar68,auVar123);
  auVar62 = vfnmadd231ps_fma(auVar45,auVar107,auVar114);
  auVar45 = vshufps_avx(auVar56,auVar56,0xc9);
  auVar60 = vshufps_avx512vl(auVar61,auVar61,0xc9);
  fVar213 = auVar56._0_4_;
  auVar224._0_4_ = fVar213 * auVar60._0_4_;
  fVar214 = auVar56._4_4_;
  auVar224._4_4_ = fVar214 * auVar60._4_4_;
  fVar109 = auVar56._8_4_;
  auVar224._8_4_ = fVar109 * auVar60._8_4_;
  fVar110 = auVar56._12_4_;
  auVar224._12_4_ = fVar110 * auVar60._12_4_;
  auVar61 = vfmsub231ps_avx512vl(auVar224,auVar45,auVar61);
  auVar61 = vshufps_avx(auVar61,auVar61,0xc9);
  auVar60 = vshufps_avx512vl(auVar57,auVar57,0xc9);
  auVar234._0_4_ = fVar213 * auVar60._0_4_;
  auVar234._4_4_ = fVar214 * auVar60._4_4_;
  auVar234._8_4_ = fVar109 * auVar60._8_4_;
  auVar234._12_4_ = fVar110 * auVar60._12_4_;
  auVar45 = vfmsub231ps_avx512vl(auVar234,auVar45,auVar57);
  auVar57 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar65 = vshufps_avx512vl(auVar64,auVar64,0xc9);
  auVar45 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar45 = vmulps_avx512vl(auVar64,auVar45);
  auVar45 = vfmsub231ps_fma(auVar45,auVar65,auVar46);
  auVar60 = vshufps_avx(auVar45,auVar45,0xc9);
  auVar46 = vshufps_avx(auVar62,auVar62,0xc9);
  auVar45 = vdpps_avx(auVar61,auVar61,0x7f);
  auVar46 = vmulps_avx512vl(auVar64,auVar46);
  auVar46 = vfmsub231ps_fma(auVar46,auVar65,auVar62);
  auVar62 = vshufps_avx(auVar46,auVar46,0xc9);
  auVar46 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar65 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar66 = vmulss_avx512f(auVar45,ZEXT416(0xbf000000));
  auVar66 = vmulss_avx512f(auVar66,auVar46);
  auVar46 = vmulss_avx512f(auVar66,ZEXT416((uint)(auVar46._0_4_ * auVar46._0_4_)));
  auVar46 = vaddss_avx512f(auVar65,auVar46);
  auVar251._0_4_ = auVar46._0_4_;
  auVar251._4_4_ = auVar251._0_4_;
  auVar251._8_4_ = auVar251._0_4_;
  auVar251._12_4_ = auVar251._0_4_;
  auVar65 = vmulps_avx512vl(auVar61,auVar251);
  auVar46 = vdpps_avx(auVar61,auVar57,0x7f);
  auVar66 = vbroadcastss_avx512vl(auVar45);
  auVar57 = vmulps_avx512vl(auVar66,auVar57);
  fVar132 = auVar46._0_4_;
  auVar67._0_4_ = auVar61._0_4_ * fVar132;
  auVar67._4_4_ = auVar61._4_4_ * fVar132;
  auVar67._8_4_ = auVar61._8_4_ * fVar132;
  auVar67._12_4_ = auVar61._12_4_ * fVar132;
  auVar61 = vsubps_avx(auVar57,auVar67);
  auVar46 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar46,ZEXT416(0x40000000));
  fVar105 = auVar46._0_4_ * auVar45._0_4_;
  auVar45 = vdpps_avx(auVar60,auVar60,0x7f);
  auVar46 = vrsqrt14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar57 = vmulss_avx512f(auVar46,ZEXT416(0x3fc00000));
  auVar66 = vmulss_avx512f(auVar45,ZEXT416(0xbf000000));
  auVar67 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  fVar132 = auVar46._0_4_;
  fVar132 = auVar57._0_4_ + auVar66._0_4_ * fVar132 * fVar132 * fVar132;
  auVar243._0_4_ = auVar60._0_4_ * fVar132;
  auVar243._4_4_ = auVar60._4_4_ * fVar132;
  auVar243._8_4_ = auVar60._8_4_ * fVar132;
  auVar243._12_4_ = auVar60._12_4_ * fVar132;
  auVar46 = vdpps_avx(auVar60,auVar62,0x7f);
  auVar57 = vbroadcastss_avx512vl(auVar45);
  auVar57 = vmulps_avx512vl(auVar57,auVar62);
  fVar199 = auVar46._0_4_;
  auVar200._0_4_ = fVar199 * auVar60._0_4_;
  auVar200._4_4_ = fVar199 * auVar60._4_4_;
  auVar200._8_4_ = fVar199 * auVar60._8_4_;
  auVar200._12_4_ = fVar199 * auVar60._12_4_;
  auVar46 = vsubps_avx(auVar57,auVar200);
  auVar57 = vrcp14ss_avx512f(auVar107,ZEXT416(auVar45._0_4_));
  auVar45 = vfnmadd213ss_avx512f(auVar45,auVar57,ZEXT416(0x40000000));
  auVar259 = ZEXT464(0x3f800000);
  fVar199 = auVar45._0_4_ * auVar57._0_4_;
  auVar57 = vshufps_avx512vl(auVar55,auVar55,0xff);
  auVar60 = vmulps_avx512vl(auVar57,auVar65);
  auVar62 = vsubps_avx512vl(auVar55,auVar60);
  auVar45 = vshufps_avx(auVar56,auVar56,0xff);
  auVar45 = vmulps_avx512vl(auVar45,auVar65);
  auVar51._0_4_ = auVar45._0_4_ + auVar57._0_4_ * auVar251._0_4_ * fVar105 * auVar61._0_4_;
  auVar51._4_4_ = auVar45._4_4_ + auVar57._4_4_ * auVar251._0_4_ * fVar105 * auVar61._4_4_;
  auVar51._8_4_ = auVar45._8_4_ + auVar57._8_4_ * auVar251._0_4_ * fVar105 * auVar61._8_4_;
  auVar51._12_4_ = auVar45._12_4_ + auVar57._12_4_ * auVar251._0_4_ * fVar105 * auVar61._12_4_;
  auVar45 = vsubps_avx(auVar56,auVar51);
  auVar61 = vaddps_avx512vl(auVar55,auVar60);
  auVar56._0_4_ = fVar213 + auVar51._0_4_;
  auVar56._4_4_ = fVar214 + auVar51._4_4_;
  auVar56._8_4_ = fVar109 + auVar51._8_4_;
  auVar56._12_4_ = fVar110 + auVar51._12_4_;
  auVar57 = vshufps_avx512vl(auVar63,auVar63,0xff);
  auVar235._0_4_ = auVar57._0_4_ * auVar243._0_4_;
  auVar235._4_4_ = auVar57._4_4_ * auVar243._4_4_;
  auVar235._8_4_ = auVar57._8_4_ * auVar243._8_4_;
  auVar235._12_4_ = auVar57._12_4_ * auVar243._12_4_;
  auVar60 = vsubps_avx512vl(auVar63,auVar235);
  auVar65 = vshufps_avx512vl(auVar64,auVar64,0xff);
  auVar65 = vmulps_avx512vl(auVar65,auVar243);
  auVar70._0_4_ = auVar65._0_4_ + auVar57._0_4_ * fVar132 * auVar46._0_4_ * fVar199;
  auVar70._4_4_ = auVar65._4_4_ + auVar57._4_4_ * fVar132 * auVar46._4_4_ * fVar199;
  auVar70._8_4_ = auVar65._8_4_ + auVar57._8_4_ * fVar132 * auVar46._8_4_ * fVar199;
  auVar70._12_4_ = auVar65._12_4_ + auVar57._12_4_ * fVar132 * auVar46._12_4_ * fVar199;
  auVar46 = vsubps_avx512vl(auVar64,auVar70);
  auVar57 = vaddps_avx512vl(auVar63,auVar235);
  auVar64 = vaddps_avx512vl(auVar64,auVar70);
  auVar45 = vmulps_avx512vl(auVar45,auVar50);
  auVar201._0_4_ = auVar62._0_4_ + auVar45._0_4_;
  auVar201._4_4_ = auVar62._4_4_ + auVar45._4_4_;
  auVar201._8_4_ = auVar62._8_4_ + auVar45._8_4_;
  auVar201._12_4_ = auVar62._12_4_ + auVar45._12_4_;
  auVar45 = vmulps_avx512vl(auVar46,auVar50);
  auVar45 = vsubps_avx(auVar60,auVar45);
  auVar46 = vmulps_avx512vl(auVar56,auVar50);
  auVar68._0_4_ = auVar61._0_4_ + auVar46._0_4_;
  auVar68._4_4_ = auVar61._4_4_ + auVar46._4_4_;
  auVar68._8_4_ = auVar61._8_4_ + auVar46._8_4_;
  auVar68._12_4_ = auVar61._12_4_ + auVar46._12_4_;
  auVar46 = vmulps_avx512vl(auVar64,auVar50);
  auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar260 = ZEXT1664(auVar50);
  auVar46 = vsubps_avx(auVar57,auVar46);
  auVar64 = vbroadcastss_avx512vl(auVar48);
  auVar65 = vsubss_avx512f(ZEXT416(0x3f800000),auVar48);
  auVar66._0_4_ = auVar65._0_4_;
  auVar66._4_4_ = auVar66._0_4_;
  auVar66._8_4_ = auVar66._0_4_;
  auVar66._12_4_ = auVar66._0_4_;
  auVar62 = vmulps_avx512vl(auVar64,auVar62);
  auVar65 = vmulps_avx512vl(auVar64,auVar201);
  auVar45 = vmulps_avx512vl(auVar64,auVar45);
  auVar252._0_4_ = auVar64._0_4_ * auVar60._0_4_;
  auVar252._4_4_ = auVar64._4_4_ * auVar60._4_4_;
  auVar252._8_4_ = auVar64._8_4_ * auVar60._8_4_;
  auVar252._12_4_ = auVar64._12_4_ * auVar60._12_4_;
  local_218 = vfmadd231ps_avx512vl(auVar62,auVar66,auVar59);
  local_228 = vfmadd231ps_avx512vl(auVar65,auVar66,auVar164);
  local_238 = vfmadd231ps_avx512vl(auVar45,auVar66,auVar58);
  local_248 = vfmadd231ps_fma(auVar252,auVar66,auVar52);
  auVar45 = vmulps_avx512vl(auVar64,auVar61);
  auVar61 = vmulps_avx512vl(auVar64,auVar68);
  auVar46 = vmulps_avx512vl(auVar64,auVar46);
  auVar236._0_4_ = auVar64._0_4_ * auVar57._0_4_;
  auVar236._4_4_ = auVar64._4_4_ * auVar57._4_4_;
  auVar236._8_4_ = auVar64._8_4_ * auVar57._8_4_;
  auVar236._12_4_ = auVar64._12_4_ * auVar57._12_4_;
  _local_258 = vfmadd231ps_avx512vl(auVar45,auVar66,auVar47);
  _local_268 = vfmadd231ps_avx512vl(auVar61,auVar66,_local_498);
  _local_278 = vfmadd231ps_avx512vl(auVar46,auVar66,auVar54);
  _local_288 = vfmadd231ps_fma(auVar236,auVar66,auVar53);
  auVar45 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar45 = vinsertps_avx(auVar45,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar132 = *(float *)(ray + k * 4 + 0x30);
  local_198 = vsubps_avx512vl(local_218,auVar45);
  uVar106 = local_198._0_4_;
  auVar113._4_4_ = uVar106;
  auVar113._0_4_ = uVar106;
  auVar113._8_4_ = uVar106;
  auVar113._12_4_ = uVar106;
  auVar46 = vshufps_avx(local_198,local_198,0x55);
  auVar61 = vshufps_avx(local_198,local_198,0xaa);
  aVar3 = pre->ray_space[k].vx.field_0;
  aVar4 = pre->ray_space[k].vy.field_0;
  fVar105 = pre->ray_space[k].vz.field_0.m128[0];
  fVar199 = pre->ray_space[k].vz.field_0.m128[1];
  fVar213 = pre->ray_space[k].vz.field_0.m128[2];
  fVar214 = pre->ray_space[k].vz.field_0.m128[3];
  auVar65._0_4_ = fVar105 * auVar61._0_4_;
  auVar65._4_4_ = fVar199 * auVar61._4_4_;
  auVar65._8_4_ = fVar213 * auVar61._8_4_;
  auVar65._12_4_ = fVar214 * auVar61._12_4_;
  auVar46 = vfmadd231ps_fma(auVar65,(undefined1  [16])aVar4,auVar46);
  auVar58 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar113);
  local_1a8 = vsubps_avx512vl(local_228,auVar45);
  uVar106 = local_1a8._0_4_;
  auVar123._4_4_ = uVar106;
  auVar123._0_4_ = uVar106;
  auVar123._8_4_ = uVar106;
  auVar123._12_4_ = uVar106;
  auVar46 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar61 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar114._0_4_ = fVar105 * auVar61._0_4_;
  auVar114._4_4_ = fVar199 * auVar61._4_4_;
  auVar114._8_4_ = fVar213 * auVar61._8_4_;
  auVar114._12_4_ = fVar214 * auVar61._12_4_;
  auVar46 = vfmadd231ps_fma(auVar114,(undefined1  [16])aVar4,auVar46);
  auVar59 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar123);
  local_1b8 = vsubps_avx512vl(local_238,auVar45);
  uVar106 = local_1b8._0_4_;
  auVar52._4_4_ = uVar106;
  auVar52._0_4_ = uVar106;
  auVar52._8_4_ = uVar106;
  auVar52._12_4_ = uVar106;
  auVar46 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar61 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar48._0_4_ = fVar105 * auVar61._0_4_;
  auVar48._4_4_ = fVar199 * auVar61._4_4_;
  auVar48._8_4_ = fVar213 * auVar61._8_4_;
  auVar48._12_4_ = fVar214 * auVar61._12_4_;
  auVar46 = vfmadd231ps_fma(auVar48,(undefined1  [16])aVar4,auVar46);
  auVar64 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar52);
  local_1c8 = vsubps_avx(local_248,auVar45);
  uVar106 = local_1c8._0_4_;
  auVar180._4_4_ = uVar106;
  auVar180._0_4_ = uVar106;
  auVar180._8_4_ = uVar106;
  auVar180._12_4_ = uVar106;
  auVar46 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar61 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar53._0_4_ = fVar105 * auVar61._0_4_;
  auVar53._4_4_ = fVar199 * auVar61._4_4_;
  auVar53._8_4_ = fVar213 * auVar61._8_4_;
  auVar53._12_4_ = fVar214 * auVar61._12_4_;
  auVar46 = vfmadd231ps_fma(auVar53,(undefined1  [16])aVar4,auVar46);
  auVar65 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar180);
  local_1d8 = vsubps_avx512vl(_local_258,auVar45);
  uVar106 = local_1d8._0_4_;
  auVar181._4_4_ = uVar106;
  auVar181._0_4_ = uVar106;
  auVar181._8_4_ = uVar106;
  auVar181._12_4_ = uVar106;
  auVar46 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar61 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar202._0_4_ = auVar61._0_4_ * fVar105;
  auVar202._4_4_ = auVar61._4_4_ * fVar199;
  auVar202._8_4_ = auVar61._8_4_ * fVar213;
  auVar202._12_4_ = auVar61._12_4_ * fVar214;
  auVar46 = vfmadd231ps_fma(auVar202,(undefined1  [16])aVar4,auVar46);
  auVar66 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar181);
  local_1e8 = vsubps_avx512vl(_local_268,auVar45);
  uVar106 = local_1e8._0_4_;
  auVar182._4_4_ = uVar106;
  auVar182._0_4_ = uVar106;
  auVar182._8_4_ = uVar106;
  auVar182._12_4_ = uVar106;
  auVar46 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar61 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar218._0_4_ = auVar61._0_4_ * fVar105;
  auVar218._4_4_ = auVar61._4_4_ * fVar199;
  auVar218._8_4_ = auVar61._8_4_ * fVar213;
  auVar218._12_4_ = auVar61._12_4_ * fVar214;
  auVar46 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar4,auVar46);
  auVar113 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar182);
  local_1f8 = vsubps_avx512vl(_local_278,auVar45);
  uVar106 = local_1f8._0_4_;
  auVar183._4_4_ = uVar106;
  auVar183._0_4_ = uVar106;
  auVar183._8_4_ = uVar106;
  auVar183._12_4_ = uVar106;
  auVar46 = vshufps_avx(local_1f8,local_1f8,0x55);
  auVar61 = vshufps_avx(local_1f8,local_1f8,0xaa);
  auVar225._0_4_ = auVar61._0_4_ * fVar105;
  auVar225._4_4_ = auVar61._4_4_ * fVar199;
  auVar225._8_4_ = auVar61._8_4_ * fVar213;
  auVar225._12_4_ = auVar61._12_4_ * fVar214;
  auVar46 = vfmadd231ps_fma(auVar225,(undefined1  [16])aVar4,auVar46);
  auVar114 = vfmadd231ps_fma(auVar46,(undefined1  [16])aVar3,auVar183);
  local_208 = vsubps_avx(_local_288,auVar45);
  uVar106 = local_208._0_4_;
  auVar49._4_4_ = uVar106;
  auVar49._0_4_ = uVar106;
  auVar49._8_4_ = uVar106;
  auVar49._12_4_ = uVar106;
  auVar45 = vshufps_avx(local_208,local_208,0x55);
  auVar46 = vshufps_avx(local_208,local_208,0xaa);
  auVar165._0_4_ = auVar46._0_4_ * fVar105;
  auVar165._4_4_ = auVar46._4_4_ * fVar199;
  auVar165._8_4_ = auVar46._8_4_ * fVar213;
  auVar165._12_4_ = auVar46._12_4_ * fVar214;
  auVar45 = vfmadd231ps_fma(auVar165,(undefined1  [16])aVar4,auVar45);
  auVar123 = vfmadd231ps_fma(auVar45,(undefined1  [16])aVar3,auVar49);
  auVar61 = vmovlhps_avx(auVar58,auVar66);
  auVar57 = vmovlhps_avx(auVar59,auVar113);
  auVar60 = vmovlhps_avx(auVar64,auVar114);
  _local_348 = vmovlhps_avx512f(auVar65,auVar123);
  auVar46 = vminps_avx(auVar61,auVar57);
  auVar45 = vmaxps_avx(auVar61,auVar57);
  auVar62 = vminps_avx512vl(auVar60,_local_348);
  auVar46 = vminps_avx(auVar46,auVar62);
  auVar62 = vmaxps_avx512vl(auVar60,_local_348);
  auVar45 = vmaxps_avx(auVar45,auVar62);
  auVar62 = vshufpd_avx(auVar46,auVar46,3);
  auVar46 = vminps_avx(auVar46,auVar62);
  auVar62 = vshufpd_avx(auVar45,auVar45,3);
  auVar45 = vmaxps_avx(auVar45,auVar62);
  auVar46 = vandps_avx512vl(auVar46,auVar50);
  auVar45 = vandps_avx512vl(auVar45,auVar50);
  auVar45 = vmaxps_avx(auVar46,auVar45);
  auVar46 = vmovshdup_avx(auVar45);
  auVar45 = vmaxss_avx(auVar46,auVar45);
  local_318 = vmovddup_avx512vl(auVar58);
  local_328 = vmovddup_avx512vl(auVar59);
  local_338 = vmovddup_avx512vl(auVar64);
  auVar50._8_8_ = auVar65._0_8_;
  auVar50._0_8_ = auVar65._0_8_;
  local_358 = ZEXT416((uint)(auVar45._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_358);
  auVar45 = vxorps_avx512vl(local_78._0_16_,auVar67);
  local_98 = vbroadcastss_avx512vl(auVar45);
  uVar36 = 0;
  auVar45 = vsubps_avx(auVar57,auVar61);
  local_178 = vsubps_avx(auVar60,auVar57);
  local_188 = vsubps_avx512vl(_local_348,auVar60);
  local_298 = vsubps_avx512vl(_local_258,local_218);
  local_2a8 = vsubps_avx512vl(_local_268,local_228);
  auVar75 = vbroadcastss_avx512vl(ZEXT416(3));
  local_2b8 = vsubps_avx512vl(_local_278,local_238);
  _local_2c8 = vsubps_avx(_local_288,local_248);
  local_2d8 = vpbroadcastd_avx512vl();
  local_2e8 = vpbroadcastd_avx512vl();
  auVar46 = ZEXT816(0x3f80000000000000);
  auVar233 = ZEXT1664(auVar46);
  do {
    auVar48 = auVar233._0_16_;
    auVar62 = vshufps_avx(auVar48,auVar48,0x50);
    auVar237._8_4_ = 0x3f800000;
    auVar237._0_8_ = &DAT_3f8000003f800000;
    auVar237._12_4_ = 0x3f800000;
    auVar242._16_4_ = 0x3f800000;
    auVar242._0_16_ = auVar237;
    auVar242._20_4_ = 0x3f800000;
    auVar242._24_4_ = 0x3f800000;
    auVar242._28_4_ = 0x3f800000;
    auVar58 = vsubps_avx(auVar237,auVar62);
    fVar105 = auVar62._0_4_;
    fVar250 = auVar66._0_4_;
    auVar134._0_4_ = fVar250 * fVar105;
    fVar199 = auVar62._4_4_;
    fVar254 = auVar66._4_4_;
    auVar134._4_4_ = fVar254 * fVar199;
    fVar213 = auVar62._8_4_;
    auVar134._8_4_ = fVar250 * fVar213;
    fVar214 = auVar62._12_4_;
    auVar134._12_4_ = fVar254 * fVar214;
    fVar109 = auVar113._0_4_;
    auVar145._0_4_ = fVar109 * fVar105;
    fVar110 = auVar113._4_4_;
    auVar145._4_4_ = fVar110 * fVar199;
    auVar145._8_4_ = fVar109 * fVar213;
    auVar145._12_4_ = fVar110 * fVar214;
    fVar111 = auVar114._0_4_;
    auVar152._0_4_ = fVar111 * fVar105;
    fVar112 = auVar114._4_4_;
    auVar152._4_4_ = fVar112 * fVar199;
    auVar152._8_4_ = fVar111 * fVar213;
    auVar152._12_4_ = fVar112 * fVar214;
    fVar131 = auVar123._0_4_;
    auVar115._0_4_ = fVar131 * fVar105;
    fVar176 = auVar123._4_4_;
    auVar115._4_4_ = fVar176 * fVar199;
    auVar115._8_4_ = fVar131 * fVar213;
    auVar115._12_4_ = fVar176 * fVar214;
    auVar59 = vfmadd231ps_avx512vl(auVar134,auVar58,local_318);
    auVar64 = vfmadd231ps_avx512vl(auVar145,auVar58,local_328);
    auVar65 = vfmadd231ps_avx512vl(auVar152,auVar58,local_338);
    auVar58 = vfmadd231ps_fma(auVar115,auVar50,auVar58);
    auVar62 = vmovshdup_avx(auVar46);
    fVar199 = auVar46._0_4_;
    fVar105 = (auVar62._0_4_ - fVar199) * 0.04761905;
    auVar175._4_4_ = fVar199;
    auVar175._0_4_ = fVar199;
    auVar175._8_4_ = fVar199;
    auVar175._12_4_ = fVar199;
    auVar175._16_4_ = fVar199;
    auVar175._20_4_ = fVar199;
    auVar175._24_4_ = fVar199;
    auVar175._28_4_ = fVar199;
    auVar128._0_8_ = auVar62._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar74 = vsubps_avx(auVar128,auVar175);
    uVar106 = auVar59._0_4_;
    auVar129._4_4_ = uVar106;
    auVar129._0_4_ = uVar106;
    auVar129._8_4_ = uVar106;
    auVar129._12_4_ = uVar106;
    auVar129._16_4_ = uVar106;
    auVar129._20_4_ = uVar106;
    auVar129._24_4_ = uVar106;
    auVar129._28_4_ = uVar106;
    auVar196._8_4_ = 1;
    auVar196._0_8_ = 0x100000001;
    auVar196._12_4_ = 1;
    auVar196._16_4_ = 1;
    auVar196._20_4_ = 1;
    auVar196._24_4_ = 1;
    auVar196._28_4_ = 1;
    auVar87 = ZEXT1632(auVar59);
    auVar86 = vpermps_avx2(auVar196,auVar87);
    auVar76 = vbroadcastss_avx512vl(auVar64);
    auVar88 = ZEXT1632(auVar64);
    auVar77 = vpermps_avx512vl(auVar196,auVar88);
    auVar78 = vbroadcastss_avx512vl(auVar65);
    auVar72 = ZEXT1632(auVar65);
    auVar79 = vpermps_avx512vl(auVar196,auVar72);
    auVar80 = vbroadcastss_avx512vl(auVar58);
    auVar84 = ZEXT1632(auVar58);
    auVar73 = vpermps_avx512vl(auVar196,auVar84);
    auVar197._4_4_ = fVar105;
    auVar197._0_4_ = fVar105;
    auVar197._8_4_ = fVar105;
    auVar197._12_4_ = fVar105;
    auVar197._16_4_ = fVar105;
    auVar197._20_4_ = fVar105;
    auVar197._24_4_ = fVar105;
    auVar197._28_4_ = fVar105;
    auVar162._8_4_ = 2;
    auVar162._0_8_ = 0x200000002;
    auVar162._12_4_ = 2;
    auVar162._16_4_ = 2;
    auVar162._20_4_ = 2;
    auVar162._24_4_ = 2;
    auVar162._28_4_ = 2;
    auVar81 = vpermps_avx512vl(auVar162,auVar87);
    auVar82 = vpermps_avx512vl(auVar75,auVar87);
    auVar87 = vpermps_avx2(auVar162,auVar88);
    auVar71 = vpermps_avx512vl(auVar75,auVar88);
    auVar88 = vpermps_avx2(auVar162,auVar72);
    auVar72 = vpermps_avx512vl(auVar75,auVar72);
    auVar83 = vpermps_avx512vl(auVar162,auVar84);
    auVar84 = vpermps_avx512vl(auVar75,auVar84);
    auVar62 = vfmadd132ps_fma(auVar74,auVar175,_DAT_02020f20);
    auVar75 = vsubps_avx(auVar242,ZEXT1632(auVar62));
    auVar74 = vmulps_avx512vl(auVar76,ZEXT1632(auVar62));
    auVar89 = ZEXT1632(auVar62);
    auVar85 = vmulps_avx512vl(auVar77,auVar89);
    auVar58 = vfmadd231ps_fma(auVar74,auVar75,auVar129);
    auVar59 = vfmadd231ps_fma(auVar85,auVar75,auVar86);
    auVar74 = vmulps_avx512vl(auVar78,auVar89);
    auVar85 = vmulps_avx512vl(auVar79,auVar89);
    auVar74 = vfmadd231ps_avx512vl(auVar74,auVar75,auVar76);
    auVar76 = vfmadd231ps_avx512vl(auVar85,auVar75,auVar77);
    auVar77 = vmulps_avx512vl(auVar80,auVar89);
    auVar85 = ZEXT1632(auVar62);
    auVar73 = vmulps_avx512vl(auVar73,auVar85);
    auVar77 = vfmadd231ps_avx512vl(auVar77,auVar75,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar73,auVar75,auVar79);
    fVar213 = auVar62._0_4_;
    fVar214 = auVar62._4_4_;
    auVar23._4_4_ = fVar214 * auVar74._4_4_;
    auVar23._0_4_ = fVar213 * auVar74._0_4_;
    fVar215 = auVar62._8_4_;
    auVar23._8_4_ = fVar215 * auVar74._8_4_;
    fVar216 = auVar62._12_4_;
    auVar23._12_4_ = fVar216 * auVar74._12_4_;
    auVar23._16_4_ = auVar74._16_4_ * 0.0;
    auVar23._20_4_ = auVar74._20_4_ * 0.0;
    auVar23._24_4_ = auVar74._24_4_ * 0.0;
    auVar23._28_4_ = fVar199;
    auVar24._4_4_ = fVar214 * auVar76._4_4_;
    auVar24._0_4_ = fVar213 * auVar76._0_4_;
    auVar24._8_4_ = fVar215 * auVar76._8_4_;
    auVar24._12_4_ = fVar216 * auVar76._12_4_;
    auVar24._16_4_ = auVar76._16_4_ * 0.0;
    auVar24._20_4_ = auVar76._20_4_ * 0.0;
    auVar24._24_4_ = auVar76._24_4_ * 0.0;
    auVar24._28_4_ = auVar86._28_4_;
    auVar58 = vfmadd231ps_fma(auVar23,auVar75,ZEXT1632(auVar58));
    auVar59 = vfmadd231ps_fma(auVar24,auVar75,ZEXT1632(auVar59));
    auVar121._0_4_ = fVar213 * auVar77._0_4_;
    auVar121._4_4_ = fVar214 * auVar77._4_4_;
    auVar121._8_4_ = fVar215 * auVar77._8_4_;
    auVar121._12_4_ = fVar216 * auVar77._12_4_;
    auVar121._16_4_ = auVar77._16_4_ * 0.0;
    auVar121._20_4_ = auVar77._20_4_ * 0.0;
    auVar121._24_4_ = auVar77._24_4_ * 0.0;
    auVar121._28_4_ = 0;
    auVar25._4_4_ = fVar214 * auVar78._4_4_;
    auVar25._0_4_ = fVar213 * auVar78._0_4_;
    auVar25._8_4_ = fVar215 * auVar78._8_4_;
    auVar25._12_4_ = fVar216 * auVar78._12_4_;
    auVar25._16_4_ = auVar78._16_4_ * 0.0;
    auVar25._20_4_ = auVar78._20_4_ * 0.0;
    auVar25._24_4_ = auVar78._24_4_ * 0.0;
    auVar25._28_4_ = auVar77._28_4_;
    auVar64 = vfmadd231ps_fma(auVar121,auVar75,auVar74);
    auVar65 = vfmadd231ps_fma(auVar25,auVar75,auVar76);
    auVar26._28_4_ = auVar76._28_4_;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * auVar65._12_4_,
                            CONCAT48(fVar215 * auVar65._8_4_,
                                     CONCAT44(fVar214 * auVar65._4_4_,fVar213 * auVar65._0_4_))));
    auVar67 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar216 * auVar64._12_4_,
                                                 CONCAT48(fVar215 * auVar64._8_4_,
                                                          CONCAT44(fVar214 * auVar64._4_4_,
                                                                   fVar213 * auVar64._0_4_)))),
                              auVar75,ZEXT1632(auVar58));
    auVar47 = vfmadd231ps_fma(auVar26,auVar75,ZEXT1632(auVar59));
    auVar74 = vsubps_avx(ZEXT1632(auVar64),ZEXT1632(auVar58));
    auVar86 = vsubps_avx(ZEXT1632(auVar65),ZEXT1632(auVar59));
    auVar76 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar74 = vmulps_avx512vl(auVar74,auVar76);
    auVar86 = vmulps_avx512vl(auVar86,auVar76);
    auVar192._0_4_ = fVar105 * auVar74._0_4_;
    auVar192._4_4_ = fVar105 * auVar74._4_4_;
    auVar192._8_4_ = fVar105 * auVar74._8_4_;
    auVar192._12_4_ = fVar105 * auVar74._12_4_;
    auVar192._16_4_ = fVar105 * auVar74._16_4_;
    auVar192._20_4_ = fVar105 * auVar74._20_4_;
    auVar192._24_4_ = fVar105 * auVar74._24_4_;
    auVar192._28_4_ = 0;
    auVar74 = vmulps_avx512vl(auVar197,auVar86);
    auVar64 = vxorps_avx512vl(auVar80._0_16_,auVar80._0_16_);
    auVar86 = vpermt2ps_avx512vl(ZEXT1632(auVar67),_DAT_0205fd20,ZEXT1632(auVar64));
    auVar77 = vpermt2ps_avx512vl(ZEXT1632(auVar47),_DAT_0205fd20,ZEXT1632(auVar64));
    auVar122._0_4_ = auVar192._0_4_ + auVar67._0_4_;
    auVar122._4_4_ = auVar192._4_4_ + auVar67._4_4_;
    auVar122._8_4_ = auVar192._8_4_ + auVar67._8_4_;
    auVar122._12_4_ = auVar192._12_4_ + auVar67._12_4_;
    auVar122._16_4_ = auVar192._16_4_ + 0.0;
    auVar122._20_4_ = auVar192._20_4_ + 0.0;
    auVar122._24_4_ = auVar192._24_4_ + 0.0;
    auVar122._28_4_ = 0;
    auVar89 = ZEXT1632(auVar64);
    auVar78 = vpermt2ps_avx512vl(auVar192,_DAT_0205fd20,auVar89);
    auVar79 = vaddps_avx512vl(ZEXT1632(auVar47),auVar74);
    auVar80 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,auVar89);
    auVar74 = vsubps_avx(auVar86,auVar78);
    auVar78 = vsubps_avx512vl(auVar77,auVar80);
    auVar80 = vmulps_avx512vl(auVar87,auVar85);
    auVar73 = vmulps_avx512vl(auVar71,auVar85);
    auVar80 = vfmadd231ps_avx512vl(auVar80,auVar75,auVar81);
    auVar73 = vfmadd231ps_avx512vl(auVar73,auVar75,auVar82);
    auVar81 = vmulps_avx512vl(auVar88,auVar85);
    auVar82 = vmulps_avx512vl(auVar72,auVar85);
    auVar87 = vfmadd231ps_avx512vl(auVar81,auVar75,auVar87);
    auVar81 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar71);
    auVar82 = vmulps_avx512vl(auVar83,auVar85);
    auVar71 = vmulps_avx512vl(auVar84,auVar85);
    auVar58 = vfmadd231ps_fma(auVar82,auVar75,auVar88);
    auVar59 = vfmadd231ps_fma(auVar71,auVar75,auVar72);
    auVar82 = vmulps_avx512vl(auVar85,auVar87);
    auVar71 = vmulps_avx512vl(ZEXT1632(auVar62),auVar81);
    auVar80 = vfmadd231ps_avx512vl(auVar82,auVar75,auVar80);
    auVar73 = vfmadd231ps_avx512vl(auVar71,auVar75,auVar73);
    auVar87 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar58._12_4_,
                                            CONCAT48(fVar215 * auVar58._8_4_,
                                                     CONCAT44(fVar214 * auVar58._4_4_,
                                                              fVar213 * auVar58._0_4_)))),auVar75,
                         auVar87);
    auVar81 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar59._12_4_,
                                            CONCAT48(fVar215 * auVar59._8_4_,
                                                     CONCAT44(fVar214 * auVar59._4_4_,
                                                              fVar213 * auVar59._0_4_)))),auVar75,
                         auVar81);
    auVar27._4_4_ = fVar214 * auVar87._4_4_;
    auVar27._0_4_ = fVar213 * auVar87._0_4_;
    auVar27._8_4_ = fVar215 * auVar87._8_4_;
    auVar27._12_4_ = fVar216 * auVar87._12_4_;
    auVar27._16_4_ = auVar87._16_4_ * 0.0;
    auVar27._20_4_ = auVar87._20_4_ * 0.0;
    auVar27._24_4_ = auVar87._24_4_ * 0.0;
    auVar27._28_4_ = auVar72._28_4_;
    auVar28._4_4_ = fVar214 * auVar81._4_4_;
    auVar28._0_4_ = fVar213 * auVar81._0_4_;
    auVar28._8_4_ = fVar215 * auVar81._8_4_;
    auVar28._12_4_ = fVar216 * auVar81._12_4_;
    auVar28._16_4_ = auVar81._16_4_ * 0.0;
    auVar28._20_4_ = auVar81._20_4_ * 0.0;
    auVar28._24_4_ = auVar81._24_4_ * 0.0;
    auVar28._28_4_ = auVar88._28_4_;
    auVar88 = vfmadd231ps_avx512vl(auVar27,auVar75,auVar80);
    auVar82 = vfmadd231ps_avx512vl(auVar28,auVar73,auVar75);
    auVar75 = vsubps_avx512vl(auVar87,auVar80);
    auVar87 = vsubps_avx512vl(auVar81,auVar73);
    auVar75 = vmulps_avx512vl(auVar75,auVar76);
    auVar87 = vmulps_avx512vl(auVar87,auVar76);
    fVar199 = fVar105 * auVar75._0_4_;
    fVar213 = fVar105 * auVar75._4_4_;
    auVar29._4_4_ = fVar213;
    auVar29._0_4_ = fVar199;
    fVar214 = fVar105 * auVar75._8_4_;
    auVar29._8_4_ = fVar214;
    fVar215 = fVar105 * auVar75._12_4_;
    auVar29._12_4_ = fVar215;
    fVar216 = fVar105 * auVar75._16_4_;
    auVar29._16_4_ = fVar216;
    fVar217 = fVar105 * auVar75._20_4_;
    auVar29._20_4_ = fVar217;
    fVar105 = fVar105 * auVar75._24_4_;
    auVar29._24_4_ = fVar105;
    auVar29._28_4_ = auVar75._28_4_;
    auVar87 = vmulps_avx512vl(auVar197,auVar87);
    auVar76 = vpermt2ps_avx512vl(auVar88,_DAT_0205fd20,auVar89);
    auVar80 = vpermt2ps_avx512vl(auVar82,_DAT_0205fd20,auVar89);
    auVar198._0_4_ = auVar88._0_4_ + fVar199;
    auVar198._4_4_ = auVar88._4_4_ + fVar213;
    auVar198._8_4_ = auVar88._8_4_ + fVar214;
    auVar198._12_4_ = auVar88._12_4_ + fVar215;
    auVar198._16_4_ = auVar88._16_4_ + fVar216;
    auVar198._20_4_ = auVar88._20_4_ + fVar217;
    auVar198._24_4_ = auVar88._24_4_ + fVar105;
    auVar198._28_4_ = auVar88._28_4_ + auVar75._28_4_;
    auVar75 = vpermt2ps_avx512vl(auVar29,_DAT_0205fd20,ZEXT1632(auVar64));
    auVar73 = vaddps_avx512vl(auVar82,auVar87);
    auVar87 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,ZEXT1632(auVar64));
    auVar75 = vsubps_avx(auVar76,auVar75);
    auVar87 = vsubps_avx512vl(auVar80,auVar87);
    auVar139 = ZEXT1632(auVar67);
    auVar81 = vsubps_avx512vl(auVar88,auVar139);
    auVar150 = ZEXT1632(auVar47);
    auVar71 = vsubps_avx512vl(auVar82,auVar150);
    auVar72 = vsubps_avx512vl(auVar76,auVar86);
    auVar81 = vaddps_avx512vl(auVar81,auVar72);
    auVar72 = vsubps_avx512vl(auVar80,auVar77);
    auVar71 = vaddps_avx512vl(auVar71,auVar72);
    auVar72 = vmulps_avx512vl(auVar150,auVar81);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar139,auVar71);
    auVar83 = vmulps_avx512vl(auVar79,auVar81);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar122,auVar71);
    auVar84 = vmulps_avx512vl(auVar78,auVar81);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar74,auVar71);
    auVar85 = vmulps_avx512vl(auVar77,auVar81);
    auVar85 = vfnmadd231ps_avx512vl(auVar85,auVar86,auVar71);
    auVar89 = vmulps_avx512vl(auVar82,auVar81);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar88,auVar71);
    auVar90 = vmulps_avx512vl(auVar73,auVar81);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar198,auVar71);
    auVar91 = vmulps_avx512vl(auVar87,auVar81);
    auVar91 = vfnmadd231ps_avx512vl(auVar91,auVar75,auVar71);
    auVar81 = vmulps_avx512vl(auVar80,auVar81);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar76,auVar71);
    auVar71 = vminps_avx512vl(auVar72,auVar83);
    auVar72 = vmaxps_avx512vl(auVar72,auVar83);
    auVar83 = vminps_avx512vl(auVar84,auVar85);
    auVar71 = vminps_avx512vl(auVar71,auVar83);
    auVar83 = vmaxps_avx512vl(auVar84,auVar85);
    auVar72 = vmaxps_avx512vl(auVar72,auVar83);
    auVar83 = vminps_avx512vl(auVar89,auVar90);
    auVar84 = vmaxps_avx512vl(auVar89,auVar90);
    auVar85 = vminps_avx512vl(auVar91,auVar81);
    auVar83 = vminps_avx512vl(auVar83,auVar85);
    auVar71 = vminps_avx512vl(auVar71,auVar83);
    auVar81 = vmaxps_avx512vl(auVar91,auVar81);
    auVar81 = vmaxps_avx512vl(auVar84,auVar81);
    auVar81 = vmaxps_avx512vl(auVar72,auVar81);
    auVar62 = auVar81._0_16_;
    uVar17 = vcmpps_avx512vl(auVar71,local_78,2);
    uVar18 = vcmpps_avx512vl(auVar81,local_98,5);
    uVar39 = 0;
    bVar33 = (byte)uVar17 & (byte)uVar18 & 0x7f;
    if (bVar33 != 0) {
      auVar81 = vsubps_avx512vl(auVar86,auVar139);
      auVar71 = vsubps_avx512vl(auVar77,auVar150);
      auVar72 = vsubps_avx512vl(auVar76,auVar88);
      auVar81 = vaddps_avx512vl(auVar81,auVar72);
      auVar62 = auVar81._0_16_;
      auVar72 = vsubps_avx512vl(auVar80,auVar82);
      auVar71 = vaddps_avx512vl(auVar71,auVar72);
      auVar72 = vmulps_avx512vl(auVar150,auVar81);
      auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar71,auVar139);
      auVar79 = vmulps_avx512vl(auVar79,auVar81);
      auVar79 = vfnmadd213ps_avx512vl(auVar122,auVar71,auVar79);
      auVar78 = vmulps_avx512vl(auVar78,auVar81);
      auVar78 = vfnmadd213ps_avx512vl(auVar74,auVar71,auVar78);
      auVar74 = vmulps_avx512vl(auVar77,auVar81);
      auVar77 = vfnmadd231ps_avx512vl(auVar74,auVar71,auVar86);
      auVar74 = vmulps_avx512vl(auVar82,auVar81);
      auVar88 = vfnmadd231ps_avx512vl(auVar74,auVar71,auVar88);
      auVar74 = vmulps_avx512vl(auVar73,auVar81);
      auVar73 = vfnmadd213ps_avx512vl(auVar198,auVar71,auVar74);
      auVar74 = vmulps_avx512vl(auVar87,auVar81);
      auVar82 = vfnmadd213ps_avx512vl(auVar75,auVar71,auVar74);
      auVar75 = vmulps_avx512vl(auVar80,auVar81);
      auVar76 = vfnmadd231ps_avx512vl(auVar75,auVar76,auVar71);
      auVar74 = vminps_avx(auVar72,auVar79);
      auVar75 = vmaxps_avx(auVar72,auVar79);
      auVar86 = vminps_avx(auVar78,auVar77);
      auVar86 = vminps_avx(auVar74,auVar86);
      auVar74 = vmaxps_avx(auVar78,auVar77);
      auVar75 = vmaxps_avx(auVar75,auVar74);
      auVar87 = vminps_avx(auVar88,auVar73);
      auVar74 = vmaxps_avx(auVar88,auVar73);
      auVar88 = vminps_avx(auVar82,auVar76);
      auVar87 = vminps_avx(auVar87,auVar88);
      auVar87 = vminps_avx(auVar86,auVar87);
      auVar86 = vmaxps_avx(auVar82,auVar76);
      auVar74 = vmaxps_avx(auVar74,auVar86);
      auVar75 = vmaxps_avx(auVar75,auVar74);
      uVar17 = vcmpps_avx512vl(auVar75,local_98,5);
      uVar18 = vcmpps_avx512vl(auVar87,local_78,2);
      uVar39 = (uint)(bVar33 & (byte)uVar17 & (byte)uVar18);
    }
    if (uVar39 != 0) {
      auStack_308[uVar36] = uVar39;
      uVar17 = vmovlps_avx(auVar46);
      *(undefined8 *)(&uStack_168 + uVar36 * 2) = uVar17;
      uVar44 = vmovlps_avx512f(auVar48);
      auStack_58[uVar36] = uVar44;
      uVar36 = (ulong)((int)uVar36 + 1);
    }
    auVar46 = vxorps_avx512vl(auVar62,auVar62);
    auVar256 = ZEXT1664(auVar46);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar261 = ZEXT1664(auVar46);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar257 = ZEXT3264(auVar75);
    auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar258 = ZEXT1664(auVar46);
    do {
      auVar46 = auVar256._0_16_;
      auVar62 = auVar260._0_16_;
      if ((int)uVar36 == 0) {
        uVar106 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar22._4_4_ = uVar106;
        auVar22._0_4_ = uVar106;
        auVar22._8_4_ = uVar106;
        auVar22._12_4_ = uVar106;
        auVar22._16_4_ = uVar106;
        auVar22._20_4_ = uVar106;
        auVar22._24_4_ = uVar106;
        auVar22._28_4_ = uVar106;
        uVar17 = vcmpps_avx512vl(local_b8,auVar22,2);
        uVar42 = (uint)uVar41 & (uint)uVar41 + 0xff & (uint)uVar17;
        uVar41 = (ulong)uVar42;
        if (uVar42 == 0) {
          return;
        }
        goto LAB_01ebc72b;
      }
      uVar34 = (int)uVar36 - 1;
      uVar37 = (ulong)uVar34;
      uVar39 = (&uStack_168)[uVar37 * 2];
      fVar105 = afStack_164[uVar37 * 2];
      uVar6 = auStack_308[uVar37];
      auVar226._8_8_ = 0;
      auVar226._0_8_ = auStack_58[uVar37];
      auVar233 = ZEXT1664(auVar226);
      lVar40 = 0;
      for (uVar44 = (ulong)uVar6; (uVar44 & 1) == 0; uVar44 = uVar44 >> 1 | 0x8000000000000000) {
        lVar40 = lVar40 + 1;
      }
      uVar43 = uVar6 - 1 & uVar6;
      auStack_308[uVar37] = uVar43;
      if (uVar43 == 0) {
        uVar36 = (ulong)uVar34;
      }
      auVar58 = vcvtsi2ss_avx512f(auVar62,lVar40);
      auVar59 = vmulss_avx512f(auVar58,SUB6416(ZEXT464(0x3e124925),0));
      lVar40 = lVar40 + 1;
      auVar58 = vcvtsi2ss_avx512f(auVar62,lVar40);
      auVar58 = vmulss_avx512f(auVar58,SUB6416(ZEXT464(0x3e124925),0));
      auVar65 = auVar259._0_16_;
      auVar64 = vsubss_avx512f(auVar65,auVar59);
      auVar59 = vmulss_avx512f(ZEXT416((uint)fVar105),auVar59);
      auVar59 = vfmadd231ss_avx512f(auVar59,ZEXT416(uVar39),auVar64);
      auVar64 = vsubss_avx512f(auVar65,auVar58);
      auVar58 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * auVar58._0_4_)),ZEXT416(uVar39),auVar64);
      auVar64 = vsubss_avx512f(auVar58,auVar59);
      vucomiss_avx512f(auVar64);
      if (uVar6 == 0 || lVar40 == 0) break;
      auVar67 = vshufps_avx(auVar226,auVar226,0x50);
      vucomiss_avx512f(auVar64);
      auVar158 = auVar258._0_16_;
      auVar49 = vsubps_avx512vl(auVar158,auVar67);
      fVar105 = auVar67._0_4_;
      auVar135._0_4_ = fVar250 * fVar105;
      fVar199 = auVar67._4_4_;
      auVar135._4_4_ = fVar254 * fVar199;
      fVar213 = auVar67._8_4_;
      auVar135._8_4_ = fVar250 * fVar213;
      fVar214 = auVar67._12_4_;
      auVar135._12_4_ = fVar254 * fVar214;
      auVar146._0_4_ = fVar109 * fVar105;
      auVar146._4_4_ = fVar110 * fVar199;
      auVar146._8_4_ = fVar109 * fVar213;
      auVar146._12_4_ = fVar110 * fVar214;
      auVar153._0_4_ = fVar111 * fVar105;
      auVar153._4_4_ = fVar112 * fVar199;
      auVar153._8_4_ = fVar111 * fVar213;
      auVar153._12_4_ = fVar112 * fVar214;
      auVar116._0_4_ = fVar131 * fVar105;
      auVar116._4_4_ = fVar176 * fVar199;
      auVar116._8_4_ = fVar131 * fVar213;
      auVar116._12_4_ = fVar176 * fVar214;
      auVar67 = vfmadd231ps_fma(auVar135,auVar49,local_318);
      auVar47 = vfmadd231ps_fma(auVar146,auVar49,local_328);
      auVar48 = vfmadd231ps_fma(auVar153,auVar49,local_338);
      auVar49 = vfmadd231ps_fma(auVar116,auVar50,auVar49);
      auVar130._16_16_ = auVar67;
      auVar130._0_16_ = auVar67;
      auVar140._16_16_ = auVar47;
      auVar140._0_16_ = auVar47;
      auVar151._16_16_ = auVar48;
      auVar151._0_16_ = auVar48;
      uVar106 = auVar59._0_4_;
      auVar163._4_4_ = uVar106;
      auVar163._0_4_ = uVar106;
      auVar163._8_4_ = uVar106;
      auVar163._12_4_ = uVar106;
      uVar106 = auVar58._0_4_;
      auVar163._20_4_ = uVar106;
      auVar163._16_4_ = uVar106;
      auVar163._24_4_ = uVar106;
      auVar163._28_4_ = uVar106;
      auVar75 = vsubps_avx(auVar140,auVar130);
      auVar47 = vfmadd213ps_fma(auVar75,auVar163,auVar130);
      auVar75 = vsubps_avx(auVar151,auVar140);
      auVar51 = vfmadd213ps_fma(auVar75,auVar163,auVar140);
      auVar67 = vsubps_avx(auVar49,auVar48);
      auVar141._16_16_ = auVar67;
      auVar141._0_16_ = auVar67;
      auVar67 = vfmadd213ps_fma(auVar141,auVar163,auVar151);
      auVar75 = vsubps_avx(ZEXT1632(auVar51),ZEXT1632(auVar47));
      auVar47 = vfmadd213ps_fma(auVar75,auVar163,ZEXT1632(auVar47));
      auVar75 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar51));
      auVar67 = vfmadd213ps_fma(auVar75,auVar163,ZEXT1632(auVar51));
      auVar75 = vsubps_avx(ZEXT1632(auVar67),ZEXT1632(auVar47));
      auVar69 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar75,auVar163);
      auVar75 = vmulps_avx512vl(auVar75,auVar257._0_32_);
      auVar93._16_16_ = auVar75._16_16_;
      auVar67 = vmulss_avx512f(auVar64,SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar105 = auVar67._0_4_;
      auVar154._0_8_ =
           CONCAT44(auVar69._4_4_ + fVar105 * auVar75._4_4_,auVar69._0_4_ + fVar105 * auVar75._0_4_)
      ;
      auVar154._8_4_ = auVar69._8_4_ + fVar105 * auVar75._8_4_;
      auVar154._12_4_ = auVar69._12_4_ + fVar105 * auVar75._12_4_;
      auVar136._0_4_ = fVar105 * auVar75._16_4_;
      auVar136._4_4_ = fVar105 * auVar75._20_4_;
      auVar136._8_4_ = fVar105 * auVar75._24_4_;
      auVar136._12_4_ = fVar105 * auVar75._28_4_;
      auVar107 = vsubps_avx((undefined1  [16])0x0,auVar136);
      auVar53 = vshufpd_avx(auVar69,auVar69,3);
      auVar54 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar67 = vsubps_avx(auVar53,auVar69);
      auVar47 = vsubps_avx(auVar54,(undefined1  [16])0x0);
      auVar166._0_4_ = auVar47._0_4_ + auVar67._0_4_;
      auVar166._4_4_ = auVar47._4_4_ + auVar67._4_4_;
      auVar166._8_4_ = auVar47._8_4_ + auVar67._8_4_;
      auVar166._12_4_ = auVar47._12_4_ + auVar67._12_4_;
      auVar67 = vshufps_avx(auVar69,auVar69,0xb1);
      auVar47 = vshufps_avx(auVar154,auVar154,0xb1);
      auVar48 = vshufps_avx(auVar107,auVar107,0xb1);
      auVar49 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar227._4_4_ = auVar166._0_4_;
      auVar227._0_4_ = auVar166._0_4_;
      auVar227._8_4_ = auVar166._0_4_;
      auVar227._12_4_ = auVar166._0_4_;
      auVar51 = vshufps_avx(auVar166,auVar166,0x55);
      fVar105 = auVar51._0_4_;
      auVar184._0_4_ = auVar67._0_4_ * fVar105;
      fVar199 = auVar51._4_4_;
      auVar184._4_4_ = auVar67._4_4_ * fVar199;
      fVar213 = auVar51._8_4_;
      auVar184._8_4_ = auVar67._8_4_ * fVar213;
      fVar214 = auVar51._12_4_;
      auVar184._12_4_ = auVar67._12_4_ * fVar214;
      auVar193._0_4_ = auVar47._0_4_ * fVar105;
      auVar193._4_4_ = auVar47._4_4_ * fVar199;
      auVar193._8_4_ = auVar47._8_4_ * fVar213;
      auVar193._12_4_ = auVar47._12_4_ * fVar214;
      auVar203._0_4_ = auVar48._0_4_ * fVar105;
      auVar203._4_4_ = auVar48._4_4_ * fVar199;
      auVar203._8_4_ = auVar48._8_4_ * fVar213;
      auVar203._12_4_ = auVar48._12_4_ * fVar214;
      auVar167._0_4_ = auVar49._0_4_ * fVar105;
      auVar167._4_4_ = auVar49._4_4_ * fVar199;
      auVar167._8_4_ = auVar49._8_4_ * fVar213;
      auVar167._12_4_ = auVar49._12_4_ * fVar214;
      auVar67 = vfmadd231ps_fma(auVar184,auVar227,auVar69);
      auVar47 = vfmadd231ps_fma(auVar193,auVar227,auVar154);
      auVar51 = vfmadd231ps_fma(auVar203,auVar227,auVar107);
      auVar68 = vfmadd231ps_fma(auVar167,(undefined1  [16])0x0,auVar227);
      auVar52 = vshufpd_avx(auVar67,auVar67,1);
      auVar55 = vshufpd_avx(auVar47,auVar47,1);
      auVar56 = vshufpd_avx(auVar51,auVar51,1);
      auVar63 = vshufpd_avx(auVar68,auVar68,1);
      auVar48 = vminss_avx(auVar67,auVar47);
      auVar67 = vmaxss_avx(auVar47,auVar67);
      auVar49 = vminss_avx(auVar51,auVar68);
      auVar47 = vmaxss_avx(auVar68,auVar51);
      auVar49 = vminss_avx(auVar48,auVar49);
      auVar67 = vmaxss_avx(auVar47,auVar67);
      auVar51 = vminss_avx(auVar52,auVar55);
      auVar47 = vmaxss_avx(auVar55,auVar52);
      auVar52 = vminss_avx(auVar56,auVar63);
      auVar48 = vmaxss_avx(auVar63,auVar56);
      auVar51 = vminss_avx(auVar51,auVar52);
      auVar47 = vmaxss_avx(auVar48,auVar47);
      vucomiss_avx512f(auVar49);
      fVar199 = auVar47._0_4_;
      fVar105 = auVar67._0_4_;
      if (((uint)uVar36 < 5) || (fVar199 <= -0.0001)) {
        uVar17 = vcmpps_avx512vl(auVar51,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar18 = vcmpps_avx512vl(auVar49,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar105 & ((byte)uVar18 | (byte)uVar17)) != 0) goto LAB_01ebda55;
        uVar17 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar47,5);
        uVar18 = vcmpps_avx512vl(auVar51,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar18 | (ushort)uVar17) & 1) == 0) goto LAB_01ebda55;
LAB_01ebe470:
        bVar15 = true;
        auVar233 = ZEXT1664(auVar226);
      }
      else {
LAB_01ebda55:
        uVar17 = vcmpss_avx512f(auVar49,auVar46,1);
        bVar15 = (bool)((byte)uVar17 & 1);
        iVar104 = auVar259._0_4_;
        fVar213 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar104);
        uVar17 = vcmpss_avx512f(auVar67,auVar46,1);
        bVar15 = (bool)((byte)uVar17 & 1);
        fVar214 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar104);
        bVar15 = fVar213 != fVar214;
        iVar255 = auVar256._0_4_;
        auVar93._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar92._4_28_ = auVar93._4_28_;
        auVar92._0_4_ = (uint)bVar15 * iVar255 + (uint)!bVar15 * 0x7f800000;
        auVar52 = auVar92._0_16_;
        auVar95._16_16_ = auVar93._16_16_;
        auVar95._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar94._4_28_ = auVar95._4_28_;
        auVar94._0_4_ = (uint)bVar15 * iVar255 + (uint)!bVar15 * -0x800000;
        auVar48 = auVar94._0_16_;
        uVar17 = vcmpss_avx512f(auVar51,auVar46,1);
        bVar15 = (bool)((byte)uVar17 & 1);
        fVar215 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar104);
        if ((fVar213 != fVar215) || (NAN(fVar213) || NAN(fVar215))) {
          fVar216 = auVar51._0_4_;
          fVar213 = auVar49._0_4_;
          bVar15 = fVar216 == fVar213;
          if ((!bVar15) || (NAN(fVar216) || NAN(fVar213))) {
            auVar21._8_4_ = 0x80000000;
            auVar21._0_8_ = 0x8000000080000000;
            auVar21._12_4_ = 0x80000000;
            auVar49 = vxorps_avx512vl(auVar49,auVar21);
            auVar244._0_4_ = auVar49._0_4_ / (fVar216 - fVar213);
            auVar244._4_12_ = auVar49._4_12_;
            auVar49 = vsubss_avx512f(auVar65,auVar244);
            auVar51 = vfmadd213ss_avx512f(auVar49,auVar46,auVar244);
            auVar49 = auVar51;
          }
          else {
            vucomiss_avx512f(auVar46);
            auVar97._16_16_ = auVar93._16_16_;
            auVar97._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar96._4_28_ = auVar97._4_28_;
            auVar96._0_4_ = (uint)bVar15 * iVar255 + (uint)!bVar15 * 0x7f800000;
            auVar51 = auVar96._0_16_;
            auVar49 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar52 = vminss_avx(auVar52,auVar51);
          auVar48 = vmaxss_avx(auVar49,auVar48);
        }
        uVar17 = vcmpss_avx512f(auVar47,auVar46,1);
        bVar15 = (bool)((byte)uVar17 & 1);
        fVar213 = (float)((uint)bVar15 * -0x40800000 + (uint)!bVar15 * iVar104);
        if ((fVar214 != fVar213) || (NAN(fVar214) || NAN(fVar213))) {
          bVar15 = fVar199 == fVar105;
          if ((!bVar15) || (NAN(fVar199) || NAN(fVar105))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar67 = vxorps_avx512vl(auVar67,auVar20);
            auVar204._0_4_ = auVar67._0_4_ / (fVar199 - fVar105);
            auVar204._4_12_ = auVar67._4_12_;
            auVar67 = vsubss_avx512f(auVar65,auVar204);
            auVar47 = vfmadd213ss_avx512f(auVar67,auVar46,auVar204);
            auVar67 = auVar47;
          }
          else {
            vucomiss_avx512f(auVar46);
            auVar99._16_16_ = auVar93._16_16_;
            auVar99._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar98._4_28_ = auVar99._4_28_;
            auVar98._0_4_ = (uint)bVar15 * iVar255 + (uint)!bVar15 * 0x7f800000;
            auVar47 = auVar98._0_16_;
            auVar67 = ZEXT416((uint)bVar15 * 0x3f800000 + (uint)!bVar15 * -0x800000);
          }
          auVar52 = vminss_avx(auVar52,auVar47);
          auVar48 = vmaxss_avx(auVar67,auVar48);
        }
        bVar15 = fVar215 != fVar213;
        auVar67 = vminss_avx512f(auVar52,auVar65);
        auVar101._16_16_ = auVar93._16_16_;
        auVar101._0_16_ = auVar52;
        auVar100._4_28_ = auVar101._4_28_;
        auVar100._0_4_ = (uint)bVar15 * auVar67._0_4_ + (uint)!bVar15 * auVar52._0_4_;
        auVar67 = vmaxss_avx512f(auVar65,auVar48);
        auVar103._16_16_ = auVar93._16_16_;
        auVar103._0_16_ = auVar48;
        auVar102._4_28_ = auVar103._4_28_;
        auVar102._0_4_ = (uint)bVar15 * auVar67._0_4_ + (uint)!bVar15 * auVar48._0_4_;
        auVar67 = vmaxss_avx512f(auVar46,auVar100._0_16_);
        auVar47 = vminss_avx512f(auVar102._0_16_,auVar65);
        bVar15 = true;
        if (auVar47._0_4_ < auVar67._0_4_) goto LAB_01ebe470;
        auVar55 = vmaxss_avx512f(auVar46,ZEXT416((uint)(auVar67._0_4_ + -0.1)));
        auVar56 = vminss_avx512f(ZEXT416((uint)(auVar47._0_4_ + 0.1)),auVar65);
        auVar117._0_8_ = auVar69._0_8_;
        auVar117._8_8_ = auVar117._0_8_;
        auVar194._8_8_ = auVar154._0_8_;
        auVar194._0_8_ = auVar154._0_8_;
        auVar205._8_8_ = auVar107._0_8_;
        auVar205._0_8_ = auVar107._0_8_;
        auVar67 = vshufpd_avx(auVar154,auVar154,3);
        auVar47 = vshufpd_avx(auVar107,auVar107,3);
        auVar48 = vshufps_avx(auVar55,auVar56,0);
        auVar63 = vsubps_avx512vl(auVar158,auVar48);
        fVar105 = auVar48._0_4_;
        auVar238._0_4_ = fVar105 * auVar53._0_4_;
        fVar199 = auVar48._4_4_;
        auVar238._4_4_ = fVar199 * auVar53._4_4_;
        fVar213 = auVar48._8_4_;
        auVar238._8_4_ = fVar213 * auVar53._8_4_;
        fVar214 = auVar48._12_4_;
        auVar238._12_4_ = fVar214 * auVar53._12_4_;
        auVar155._0_4_ = fVar105 * auVar67._0_4_;
        auVar155._4_4_ = fVar199 * auVar67._4_4_;
        auVar155._8_4_ = fVar213 * auVar67._8_4_;
        auVar155._12_4_ = fVar214 * auVar67._12_4_;
        auVar159._0_4_ = fVar105 * auVar47._0_4_;
        auVar159._4_4_ = fVar199 * auVar47._4_4_;
        auVar159._8_4_ = fVar213 * auVar47._8_4_;
        auVar159._12_4_ = fVar214 * auVar47._12_4_;
        auVar137._0_4_ = fVar105 * auVar54._0_4_;
        auVar137._4_4_ = fVar199 * auVar54._4_4_;
        auVar137._8_4_ = fVar213 * auVar54._8_4_;
        auVar137._12_4_ = fVar214 * auVar54._12_4_;
        auVar49 = vfmadd231ps_fma(auVar238,auVar63,auVar117);
        auVar51 = vfmadd231ps_fma(auVar155,auVar63,auVar194);
        auVar52 = vfmadd231ps_fma(auVar159,auVar63,auVar205);
        auVar53 = vfmadd231ps_fma(auVar137,auVar63,ZEXT816(0));
        auVar67 = vsubss_avx512f(auVar65,auVar55);
        auVar47 = vmovshdup_avx512vl(auVar226);
        auVar68 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar47._0_4_ * auVar55._0_4_)),auVar226,
                                      auVar67);
        auVar67 = vsubss_avx512f(auVar65,auVar56);
        auVar69 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar56._0_4_ * auVar47._0_4_)),auVar226,
                                      auVar67);
        auVar54 = vdivss_avx512f(auVar65,auVar64);
        auVar64 = vsubps_avx(auVar51,auVar49);
        auVar124._0_4_ = auVar64._0_4_ * 3.0;
        auVar124._4_4_ = auVar64._4_4_ * 3.0;
        auVar124._8_4_ = auVar64._8_4_ * 3.0;
        auVar124._12_4_ = auVar64._12_4_ * 3.0;
        auVar64 = vsubps_avx(auVar52,auVar51);
        auVar168._0_4_ = auVar64._0_4_ * 3.0;
        auVar168._4_4_ = auVar64._4_4_ * 3.0;
        auVar168._8_4_ = auVar64._8_4_ * 3.0;
        auVar168._12_4_ = auVar64._12_4_ * 3.0;
        auVar64 = vsubps_avx(auVar53,auVar52);
        auVar185._0_4_ = auVar64._0_4_ * 3.0;
        auVar185._4_4_ = auVar64._4_4_ * 3.0;
        auVar185._8_4_ = auVar64._8_4_ * 3.0;
        auVar185._12_4_ = auVar64._12_4_ * 3.0;
        auVar67 = vminps_avx(auVar168,auVar185);
        auVar64 = vmaxps_avx(auVar168,auVar185);
        auVar67 = vminps_avx(auVar124,auVar67);
        auVar64 = vmaxps_avx(auVar124,auVar64);
        auVar47 = vshufpd_avx(auVar67,auVar67,3);
        auVar48 = vshufpd_avx(auVar64,auVar64,3);
        auVar67 = vminps_avx(auVar67,auVar47);
        auVar64 = vmaxps_avx(auVar64,auVar48);
        fVar105 = auVar54._0_4_;
        auVar186._0_4_ = fVar105 * auVar67._0_4_;
        auVar186._4_4_ = fVar105 * auVar67._4_4_;
        auVar186._8_4_ = fVar105 * auVar67._8_4_;
        auVar186._12_4_ = fVar105 * auVar67._12_4_;
        auVar169._0_4_ = fVar105 * auVar64._0_4_;
        auVar169._4_4_ = fVar105 * auVar64._4_4_;
        auVar169._8_4_ = fVar105 * auVar64._8_4_;
        auVar169._12_4_ = fVar105 * auVar64._12_4_;
        auVar54 = vdivss_avx512f(auVar65,ZEXT416((uint)(auVar69._0_4_ - auVar68._0_4_)));
        auVar64 = vshufpd_avx(auVar49,auVar49,3);
        auVar67 = vshufpd_avx(auVar51,auVar51,3);
        auVar47 = vshufpd_avx(auVar52,auVar52,3);
        auVar48 = vshufpd_avx(auVar53,auVar53,3);
        auVar64 = vsubps_avx(auVar64,auVar49);
        auVar49 = vsubps_avx(auVar67,auVar51);
        auVar51 = vsubps_avx(auVar47,auVar52);
        auVar48 = vsubps_avx(auVar48,auVar53);
        auVar67 = vminps_avx(auVar64,auVar49);
        auVar64 = vmaxps_avx(auVar64,auVar49);
        auVar47 = vminps_avx(auVar51,auVar48);
        auVar47 = vminps_avx(auVar67,auVar47);
        auVar67 = vmaxps_avx(auVar51,auVar48);
        auVar64 = vmaxps_avx(auVar64,auVar67);
        fVar105 = auVar54._0_4_;
        auVar206._0_4_ = fVar105 * auVar47._0_4_;
        auVar206._4_4_ = fVar105 * auVar47._4_4_;
        auVar206._8_4_ = fVar105 * auVar47._8_4_;
        auVar206._12_4_ = fVar105 * auVar47._12_4_;
        auVar219._0_4_ = fVar105 * auVar64._0_4_;
        auVar219._4_4_ = fVar105 * auVar64._4_4_;
        auVar219._8_4_ = fVar105 * auVar64._8_4_;
        auVar219._12_4_ = fVar105 * auVar64._12_4_;
        auVar107 = vinsertps_avx512f(auVar59,auVar68,0x10);
        auVar49 = vinsertps_avx(auVar58,auVar69,0x10);
        auVar108._0_4_ = auVar107._0_4_ + auVar49._0_4_;
        auVar108._4_4_ = auVar107._4_4_ + auVar49._4_4_;
        auVar108._8_4_ = auVar107._8_4_ + auVar49._8_4_;
        auVar108._12_4_ = auVar107._12_4_ + auVar49._12_4_;
        auVar56 = vmulps_avx512vl(auVar108,auVar261._0_16_);
        auVar47 = vshufps_avx(auVar56,auVar56,0x54);
        uVar106 = auVar56._0_4_;
        auVar125._4_4_ = uVar106;
        auVar125._0_4_ = uVar106;
        auVar125._8_4_ = uVar106;
        auVar125._12_4_ = uVar106;
        auVar48 = vfmadd213ps_avx512vl(auVar45,auVar125,auVar61);
        auVar51 = vfmadd213ps_avx512vl(local_178,auVar125,auVar57);
        auVar67 = vfmadd213ps_fma(local_188,auVar125,auVar60);
        auVar64 = vsubps_avx(auVar51,auVar48);
        auVar48 = vfmadd213ps_fma(auVar64,auVar125,auVar48);
        auVar64 = vsubps_avx(auVar67,auVar51);
        auVar64 = vfmadd213ps_fma(auVar64,auVar125,auVar51);
        auVar64 = vsubps_avx(auVar64,auVar48);
        auVar67 = vfmadd231ps_fma(auVar48,auVar64,auVar125);
        auVar126._0_8_ = CONCAT44(auVar64._4_4_ * 3.0,auVar64._0_4_ * 3.0);
        auVar126._8_4_ = auVar64._8_4_ * 3.0;
        auVar126._12_4_ = auVar64._12_4_ * 3.0;
        auVar228._8_8_ = auVar67._0_8_;
        auVar228._0_8_ = auVar67._0_8_;
        auVar64 = vshufpd_avx(auVar67,auVar67,3);
        auVar67 = vshufps_avx(auVar56,auVar56,0x55);
        auVar48 = vsubps_avx(auVar64,auVar228);
        auVar51 = vfmadd231ps_fma(auVar228,auVar67,auVar48);
        auVar245._8_8_ = auVar126._0_8_;
        auVar245._0_8_ = auVar126._0_8_;
        auVar64 = vshufpd_avx(auVar126,auVar126,3);
        auVar64 = vsubps_avx(auVar64,auVar245);
        auVar67 = vfmadd213ps_fma(auVar64,auVar67,auVar245);
        auVar127._0_8_ = auVar48._0_8_ ^ 0x8000000080000000;
        auVar127._8_4_ = auVar48._8_4_ ^ 0x80000000;
        auVar127._12_4_ = auVar48._12_4_ ^ 0x80000000;
        auVar64 = vmovshdup_avx(auVar67);
        auVar246._0_8_ = auVar64._0_8_ ^ 0x8000000080000000;
        auVar246._8_4_ = auVar64._8_4_ ^ 0x80000000;
        auVar246._12_4_ = auVar64._12_4_ ^ 0x80000000;
        auVar52 = vmovshdup_avx512vl(auVar48);
        auVar53 = vpermt2ps_avx512vl(auVar246,ZEXT416(5),auVar48);
        auVar64 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar64._0_4_ * auVar48._0_4_)),auVar67,auVar52
                                     );
        auVar67 = vpermt2ps_avx512vl(auVar67,SUB6416(ZEXT464(4),0),auVar127);
        auVar138._0_4_ = auVar64._0_4_;
        auVar138._4_4_ = auVar138._0_4_;
        auVar138._8_4_ = auVar138._0_4_;
        auVar138._12_4_ = auVar138._0_4_;
        auVar64 = vdivps_avx(auVar53,auVar138);
        auVar67 = vdivps_avx(auVar67,auVar138);
        fVar199 = auVar51._0_4_;
        auVar48 = vshufps_avx(auVar51,auVar51,0x55);
        fVar105 = auVar67._0_4_;
        auVar229._0_4_ = fVar199 * auVar64._0_4_ + auVar48._0_4_ * fVar105;
        auVar229._4_4_ = fVar199 * auVar64._4_4_ + auVar48._4_4_ * auVar67._4_4_;
        auVar229._8_4_ = fVar199 * auVar64._8_4_ + auVar48._8_4_ * auVar67._8_4_;
        auVar229._12_4_ = fVar199 * auVar64._12_4_ + auVar48._12_4_ * auVar67._12_4_;
        auVar63 = vsubps_avx(auVar47,auVar229);
        auVar51 = vmovshdup_avx(auVar64);
        auVar47 = vinsertps_avx(auVar186,auVar206,0x1c);
        auVar247._0_4_ = auVar51._0_4_ * auVar47._0_4_;
        auVar247._4_4_ = auVar51._4_4_ * auVar47._4_4_;
        auVar247._8_4_ = auVar51._8_4_ * auVar47._8_4_;
        auVar247._12_4_ = auVar51._12_4_ * auVar47._12_4_;
        auVar48 = vinsertps_avx(auVar169,auVar219,0x1c);
        auVar230._0_4_ = auVar51._0_4_ * auVar48._0_4_;
        auVar230._4_4_ = auVar51._4_4_ * auVar48._4_4_;
        auVar230._8_4_ = auVar51._8_4_ * auVar48._8_4_;
        auVar230._12_4_ = auVar51._12_4_ * auVar48._12_4_;
        auVar55 = vminps_avx512vl(auVar247,auVar230);
        auVar53 = vmaxps_avx(auVar230,auVar247);
        auVar54 = vmovshdup_avx(auVar67);
        auVar51 = vinsertps_avx(auVar206,auVar186,0x4c);
        auVar207._0_4_ = auVar54._0_4_ * auVar51._0_4_;
        auVar207._4_4_ = auVar54._4_4_ * auVar51._4_4_;
        auVar207._8_4_ = auVar54._8_4_ * auVar51._8_4_;
        auVar207._12_4_ = auVar54._12_4_ * auVar51._12_4_;
        auVar52 = vinsertps_avx(auVar219,auVar169,0x4c);
        auVar220._0_4_ = auVar54._0_4_ * auVar52._0_4_;
        auVar220._4_4_ = auVar54._4_4_ * auVar52._4_4_;
        auVar220._8_4_ = auVar54._8_4_ * auVar52._8_4_;
        auVar220._12_4_ = auVar54._12_4_ * auVar52._12_4_;
        auVar54 = vminps_avx(auVar207,auVar220);
        auVar55 = vaddps_avx512vl(auVar55,auVar54);
        auVar54 = vmaxps_avx(auVar220,auVar207);
        auVar208._0_4_ = auVar53._0_4_ + auVar54._0_4_;
        auVar208._4_4_ = auVar53._4_4_ + auVar54._4_4_;
        auVar208._8_4_ = auVar53._8_4_ + auVar54._8_4_;
        auVar208._12_4_ = auVar53._12_4_ + auVar54._12_4_;
        auVar221._8_8_ = 0x3f80000000000000;
        auVar221._0_8_ = 0x3f80000000000000;
        auVar53 = vsubps_avx(auVar221,auVar208);
        auVar54 = vsubps_avx(auVar221,auVar55);
        auVar55 = vsubps_avx(auVar107,auVar56);
        auVar56 = vsubps_avx(auVar49,auVar56);
        fVar216 = auVar55._0_4_;
        auVar248._0_4_ = fVar216 * auVar53._0_4_;
        fVar217 = auVar55._4_4_;
        auVar248._4_4_ = fVar217 * auVar53._4_4_;
        fVar133 = auVar55._8_4_;
        auVar248._8_4_ = fVar133 * auVar53._8_4_;
        fVar142 = auVar55._12_4_;
        auVar248._12_4_ = fVar142 * auVar53._12_4_;
        auVar70 = vbroadcastss_avx512vl(auVar64);
        auVar47 = vmulps_avx512vl(auVar70,auVar47);
        auVar48 = vmulps_avx512vl(auVar70,auVar48);
        auVar70 = vminps_avx512vl(auVar47,auVar48);
        auVar47 = vmaxps_avx(auVar48,auVar47);
        auVar187._0_4_ = fVar105 * auVar51._0_4_;
        auVar187._4_4_ = fVar105 * auVar51._4_4_;
        auVar187._8_4_ = fVar105 * auVar51._8_4_;
        auVar187._12_4_ = fVar105 * auVar51._12_4_;
        auVar170._0_4_ = fVar105 * auVar52._0_4_;
        auVar170._4_4_ = fVar105 * auVar52._4_4_;
        auVar170._8_4_ = fVar105 * auVar52._8_4_;
        auVar170._12_4_ = fVar105 * auVar52._12_4_;
        auVar48 = vminps_avx(auVar187,auVar170);
        auVar51 = vaddps_avx512vl(auVar70,auVar48);
        auVar52 = vmulps_avx512vl(auVar55,auVar54);
        fVar199 = auVar56._0_4_;
        auVar209._0_4_ = fVar199 * auVar53._0_4_;
        fVar213 = auVar56._4_4_;
        auVar209._4_4_ = fVar213 * auVar53._4_4_;
        fVar214 = auVar56._8_4_;
        auVar209._8_4_ = fVar214 * auVar53._8_4_;
        fVar215 = auVar56._12_4_;
        auVar209._12_4_ = fVar215 * auVar53._12_4_;
        auVar222._0_4_ = fVar199 * auVar54._0_4_;
        auVar222._4_4_ = fVar213 * auVar54._4_4_;
        auVar222._8_4_ = fVar214 * auVar54._8_4_;
        auVar222._12_4_ = fVar215 * auVar54._12_4_;
        auVar48 = vmaxps_avx(auVar170,auVar187);
        auVar171._0_4_ = auVar47._0_4_ + auVar48._0_4_;
        auVar171._4_4_ = auVar47._4_4_ + auVar48._4_4_;
        auVar171._8_4_ = auVar47._8_4_ + auVar48._8_4_;
        auVar171._12_4_ = auVar47._12_4_ + auVar48._12_4_;
        auVar188._8_8_ = 0x3f800000;
        auVar188._0_8_ = 0x3f800000;
        auVar47 = vsubps_avx(auVar188,auVar171);
        auVar48 = vsubps_avx(auVar188,auVar51);
        auVar239._0_4_ = fVar216 * auVar47._0_4_;
        auVar239._4_4_ = fVar217 * auVar47._4_4_;
        auVar239._8_4_ = fVar133 * auVar47._8_4_;
        auVar239._12_4_ = fVar142 * auVar47._12_4_;
        auVar231._0_4_ = fVar216 * auVar48._0_4_;
        auVar231._4_4_ = fVar217 * auVar48._4_4_;
        auVar231._8_4_ = fVar133 * auVar48._8_4_;
        auVar231._12_4_ = fVar142 * auVar48._12_4_;
        auVar172._0_4_ = fVar199 * auVar47._0_4_;
        auVar172._4_4_ = fVar213 * auVar47._4_4_;
        auVar172._8_4_ = fVar214 * auVar47._8_4_;
        auVar172._12_4_ = fVar215 * auVar47._12_4_;
        auVar189._0_4_ = fVar199 * auVar48._0_4_;
        auVar189._4_4_ = fVar213 * auVar48._4_4_;
        auVar189._8_4_ = fVar214 * auVar48._8_4_;
        auVar189._12_4_ = fVar215 * auVar48._12_4_;
        auVar47 = vminps_avx(auVar239,auVar231);
        auVar48 = vminps_avx(auVar172,auVar189);
        auVar51 = vminps_avx(auVar47,auVar48);
        auVar47 = vmaxps_avx(auVar231,auVar239);
        auVar48 = vmaxps_avx(auVar189,auVar172);
        auVar48 = vmaxps_avx(auVar48,auVar47);
        auVar53 = vminps_avx512vl(auVar248,auVar52);
        auVar47 = vminps_avx(auVar209,auVar222);
        auVar47 = vminps_avx(auVar53,auVar47);
        auVar47 = vhaddps_avx(auVar51,auVar47);
        auVar52 = vmaxps_avx512vl(auVar52,auVar248);
        auVar51 = vmaxps_avx(auVar222,auVar209);
        auVar51 = vmaxps_avx(auVar51,auVar52);
        auVar48 = vhaddps_avx(auVar48,auVar51);
        auVar47 = vshufps_avx(auVar47,auVar47,0xe8);
        auVar48 = vshufps_avx(auVar48,auVar48,0xe8);
        auVar173._0_4_ = auVar47._0_4_ + auVar63._0_4_;
        auVar173._4_4_ = auVar47._4_4_ + auVar63._4_4_;
        auVar173._8_4_ = auVar47._8_4_ + auVar63._8_4_;
        auVar173._12_4_ = auVar47._12_4_ + auVar63._12_4_;
        auVar190._0_4_ = auVar48._0_4_ + auVar63._0_4_;
        auVar190._4_4_ = auVar48._4_4_ + auVar63._4_4_;
        auVar190._8_4_ = auVar48._8_4_ + auVar63._8_4_;
        auVar190._12_4_ = auVar48._12_4_ + auVar63._12_4_;
        auVar47 = vmaxps_avx(auVar107,auVar173);
        auVar48 = vminps_avx(auVar190,auVar49);
        uVar44 = vcmpps_avx512vl(auVar48,auVar47,1);
        auVar47 = vinsertps_avx(auVar68,auVar69,0x10);
        auVar233 = ZEXT1664(auVar47);
        if ((uVar44 & 3) == 0) {
          vucomiss_avx512f(auVar59);
          if ((uint)uVar36 < 4 && (uVar6 == 0 || lVar40 == 0)) {
            bVar15 = false;
          }
          else {
            lVar40 = 200;
            do {
              auVar48 = vsubss_avx512f(auVar65,auVar63);
              fVar214 = auVar48._0_4_;
              fVar199 = fVar214 * fVar214 * fVar214;
              fVar215 = auVar63._0_4_;
              fVar213 = fVar215 * 3.0 * fVar214 * fVar214;
              fVar214 = fVar214 * fVar215 * fVar215 * 3.0;
              auVar156._4_4_ = fVar199;
              auVar156._0_4_ = fVar199;
              auVar156._8_4_ = fVar199;
              auVar156._12_4_ = fVar199;
              auVar147._4_4_ = fVar213;
              auVar147._0_4_ = fVar213;
              auVar147._8_4_ = fVar213;
              auVar147._12_4_ = fVar213;
              auVar118._4_4_ = fVar214;
              auVar118._0_4_ = fVar214;
              auVar118._8_4_ = fVar214;
              auVar118._12_4_ = fVar214;
              fVar215 = fVar215 * fVar215 * fVar215;
              auVar160._0_4_ = (float)local_348._0_4_ * fVar215;
              auVar160._4_4_ = (float)local_348._4_4_ * fVar215;
              auVar160._8_4_ = fStack_340 * fVar215;
              auVar160._12_4_ = fStack_33c * fVar215;
              auVar48 = vfmadd231ps_fma(auVar160,auVar60,auVar118);
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar57,auVar147);
              auVar48 = vfmadd231ps_avx512vl(auVar48,auVar61,auVar156);
              auVar119._8_8_ = auVar48._0_8_;
              auVar119._0_8_ = auVar48._0_8_;
              auVar48 = vshufpd_avx(auVar48,auVar48,3);
              auVar49 = vshufps_avx(auVar63,auVar63,0x55);
              auVar48 = vsubps_avx(auVar48,auVar119);
              auVar49 = vfmadd213ps_fma(auVar48,auVar49,auVar119);
              fVar199 = auVar49._0_4_;
              auVar48 = vshufps_avx(auVar49,auVar49,0x55);
              auVar120._0_4_ = auVar64._0_4_ * fVar199 + fVar105 * auVar48._0_4_;
              auVar120._4_4_ = auVar64._4_4_ * fVar199 + auVar67._4_4_ * auVar48._4_4_;
              auVar120._8_4_ = auVar64._8_4_ * fVar199 + auVar67._8_4_ * auVar48._8_4_;
              auVar120._12_4_ = auVar64._12_4_ * fVar199 + auVar67._12_4_ * auVar48._12_4_;
              auVar63 = vsubps_avx(auVar63,auVar120);
              auVar48 = vandps_avx512vl(auVar49,auVar62);
              auVar49 = vprolq_avx512vl(auVar48,0x20);
              auVar48 = vmaxss_avx(auVar49,auVar48);
              bVar16 = (float)local_358._0_4_ < auVar48._0_4_;
              if (auVar48._0_4_ < (float)local_358._0_4_) {
                auVar62 = vucomiss_avx512f(auVar46);
                if (bVar16) break;
                auVar64 = vucomiss_avx512f(auVar62);
                auVar259 = ZEXT1664(auVar64);
                if (bVar16) break;
                vmovshdup_avx(auVar62);
                auVar64 = vucomiss_avx512f(auVar46);
                if (bVar16) break;
                auVar65 = vucomiss_avx512f(auVar64);
                auVar259 = ZEXT1664(auVar65);
                if (bVar16) break;
                auVar67 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                        ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
                auVar55 = vinsertps_avx(auVar67,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),
                                        0x28);
                auVar67 = vdpps_avx(auVar55,local_198,0x7f);
                auVar48 = vdpps_avx(auVar55,local_1a8,0x7f);
                auVar49 = vdpps_avx(auVar55,local_1b8,0x7f);
                auVar51 = vdpps_avx(auVar55,local_1c8,0x7f);
                auVar52 = vdpps_avx(auVar55,local_1d8,0x7f);
                auVar53 = vdpps_avx(auVar55,local_1e8,0x7f);
                auVar54 = vdpps_avx(auVar55,local_1f8,0x7f);
                auVar55 = vdpps_avx(auVar55,local_208,0x7f);
                auVar56 = vsubss_avx512f(auVar65,auVar64);
                fVar214 = auVar64._0_4_;
                auVar64 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar52._0_4_)),auVar56,auVar67);
                auVar67 = vfmadd231ss_fma(ZEXT416((uint)(auVar53._0_4_ * fVar214)),auVar56,auVar48);
                auVar48 = vfmadd231ss_fma(ZEXT416((uint)(auVar54._0_4_ * fVar214)),auVar56,auVar49);
                auVar49 = vfmadd231ss_fma(ZEXT416((uint)(fVar214 * auVar55._0_4_)),auVar56,auVar51);
                auVar65 = vsubss_avx512f(auVar65,auVar62);
                auVar195._0_4_ = auVar65._0_4_;
                fVar105 = auVar195._0_4_ * auVar195._0_4_ * auVar195._0_4_;
                local_118 = auVar62._0_4_;
                fVar199 = local_118 * 3.0 * auVar195._0_4_ * auVar195._0_4_;
                fVar213 = auVar195._0_4_ * local_118 * local_118 * 3.0;
                fVar216 = local_118 * local_118 * local_118;
                auVar65 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar49._0_4_)),
                                          ZEXT416((uint)fVar213),auVar48);
                auVar65 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar199),auVar67);
                auVar64 = vfmadd231ss_fma(auVar65,ZEXT416((uint)fVar105),auVar64);
                fVar215 = auVar64._0_4_;
                if ((fVar132 <= fVar215) &&
                   (fVar217 = *(float *)(ray + k * 4 + 0x80), fVar215 <= fVar217)) {
                  local_108 = vshufps_avx(auVar62,auVar62,0x55);
                  auVar67 = vsubps_avx512vl(auVar158,local_108);
                  fVar133 = local_108._0_4_;
                  auVar210._0_4_ = fVar133 * (float)local_258._0_4_;
                  fVar142 = local_108._4_4_;
                  auVar210._4_4_ = fVar142 * (float)local_258._4_4_;
                  fVar143 = local_108._8_4_;
                  auVar210._8_4_ = fVar143 * fStack_250;
                  fVar144 = local_108._12_4_;
                  auVar210._12_4_ = fVar144 * fStack_24c;
                  auVar223._0_4_ = fVar133 * (float)local_268._0_4_;
                  auVar223._4_4_ = fVar142 * (float)local_268._4_4_;
                  auVar223._8_4_ = fVar143 * fStack_260;
                  auVar223._12_4_ = fVar144 * fStack_25c;
                  auVar232._0_4_ = fVar133 * (float)local_278._0_4_;
                  auVar232._4_4_ = fVar142 * (float)local_278._4_4_;
                  auVar232._8_4_ = fVar143 * fStack_270;
                  auVar232._12_4_ = fVar144 * fStack_26c;
                  auVar240._0_4_ = fVar133 * (float)local_288._0_4_;
                  auVar240._4_4_ = fVar142 * (float)local_288._4_4_;
                  auVar240._8_4_ = fVar143 * fStack_280;
                  auVar240._12_4_ = fVar144 * fStack_27c;
                  auVar62 = vfmadd231ps_fma(auVar210,auVar67,local_218);
                  auVar64 = vfmadd231ps_fma(auVar223,auVar67,local_228);
                  auVar65 = vfmadd231ps_fma(auVar232,auVar67,local_238);
                  auVar67 = vfmadd231ps_fma(auVar240,auVar67,local_248);
                  auVar62 = vsubps_avx(auVar64,auVar62);
                  auVar64 = vsubps_avx(auVar65,auVar64);
                  auVar65 = vsubps_avx(auVar67,auVar65);
                  auVar241._0_4_ = local_118 * auVar64._0_4_;
                  auVar241._4_4_ = local_118 * auVar64._4_4_;
                  auVar241._8_4_ = local_118 * auVar64._8_4_;
                  auVar241._12_4_ = local_118 * auVar64._12_4_;
                  auVar195._4_4_ = auVar195._0_4_;
                  auVar195._8_4_ = auVar195._0_4_;
                  auVar195._12_4_ = auVar195._0_4_;
                  auVar62 = vfmadd231ps_fma(auVar241,auVar195,auVar62);
                  auVar211._0_4_ = local_118 * auVar65._0_4_;
                  auVar211._4_4_ = local_118 * auVar65._4_4_;
                  auVar211._8_4_ = local_118 * auVar65._8_4_;
                  auVar211._12_4_ = local_118 * auVar65._12_4_;
                  auVar64 = vfmadd231ps_fma(auVar211,auVar195,auVar64);
                  auVar212._0_4_ = local_118 * auVar64._0_4_;
                  auVar212._4_4_ = local_118 * auVar64._4_4_;
                  auVar212._8_4_ = local_118 * auVar64._8_4_;
                  auVar212._12_4_ = local_118 * auVar64._12_4_;
                  auVar62 = vfmadd231ps_fma(auVar212,auVar195,auVar62);
                  auVar19._8_4_ = 0x40400000;
                  auVar19._0_8_ = 0x4040000040400000;
                  auVar19._12_4_ = 0x40400000;
                  auVar62 = vmulps_avx512vl(auVar62,auVar19);
                  pGVar7 = (context->scene->geometries).items[uVar42].ptr;
                  if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                    auVar174._0_4_ = fVar216 * (float)local_2c8._0_4_;
                    auVar174._4_4_ = fVar216 * (float)local_2c8._4_4_;
                    auVar174._8_4_ = fVar216 * fStack_2c0;
                    auVar174._12_4_ = fVar216 * fStack_2bc;
                    auVar161._4_4_ = fVar213;
                    auVar161._0_4_ = fVar213;
                    auVar161._8_4_ = fVar213;
                    auVar161._12_4_ = fVar213;
                    auVar64 = vfmadd132ps_fma(auVar161,auVar174,local_2b8);
                    auVar157._4_4_ = fVar199;
                    auVar157._0_4_ = fVar199;
                    auVar157._8_4_ = fVar199;
                    auVar157._12_4_ = fVar199;
                    auVar64 = vfmadd132ps_fma(auVar157,auVar64,local_2a8);
                    auVar148._4_4_ = fVar105;
                    auVar148._0_4_ = fVar105;
                    auVar148._8_4_ = fVar105;
                    auVar148._12_4_ = fVar105;
                    auVar67 = vfmadd132ps_fma(auVar148,auVar64,local_298);
                    auVar64 = vshufps_avx(auVar67,auVar67,0xc9);
                    auVar65 = vshufps_avx(auVar62,auVar62,0xc9);
                    auVar149._0_4_ = auVar67._0_4_ * auVar65._0_4_;
                    auVar149._4_4_ = auVar67._4_4_ * auVar65._4_4_;
                    auVar149._8_4_ = auVar67._8_4_ * auVar65._8_4_;
                    auVar149._12_4_ = auVar67._12_4_ * auVar65._12_4_;
                    auVar62 = vfmsub231ps_fma(auVar149,auVar62,auVar64);
                    auVar233 = ZEXT1664(auVar47);
                    local_128 = auVar62._0_4_;
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      *(float *)(ray + k * 4 + 0x80) = fVar215;
                      uVar106 = vextractps_avx(auVar62,1);
                      *(undefined4 *)(ray + k * 4 + 0xc0) = uVar106;
                      uVar106 = vextractps_avx(auVar62,2);
                      *(undefined4 *)(ray + k * 4 + 0xd0) = uVar106;
                      *(undefined4 *)(ray + k * 4 + 0xe0) = local_128;
                      *(float *)(ray + k * 4 + 0xf0) = local_118;
                      *(float *)(ray + k * 4 + 0x100) = fVar214;
                      *(int *)(ray + k * 4 + 0x110) = (int)uVar35;
                      *(uint *)(ray + k * 4 + 0x120) = uVar42;
                      *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                      *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    }
                    else {
                      auVar64 = vshufps_avx(auVar62,auVar62,0x55);
                      local_138 = vshufps_avx(auVar62,auVar62,0xaa);
                      local_148[0] = (RTCHitN)auVar64[0];
                      local_148[1] = (RTCHitN)auVar64[1];
                      local_148[2] = (RTCHitN)auVar64[2];
                      local_148[3] = (RTCHitN)auVar64[3];
                      local_148[4] = (RTCHitN)auVar64[4];
                      local_148[5] = (RTCHitN)auVar64[5];
                      local_148[6] = (RTCHitN)auVar64[6];
                      local_148[7] = (RTCHitN)auVar64[7];
                      local_148[8] = (RTCHitN)auVar64[8];
                      local_148[9] = (RTCHitN)auVar64[9];
                      local_148[10] = (RTCHitN)auVar64[10];
                      local_148[0xb] = (RTCHitN)auVar64[0xb];
                      local_148[0xc] = (RTCHitN)auVar64[0xc];
                      local_148[0xd] = (RTCHitN)auVar64[0xd];
                      local_148[0xe] = (RTCHitN)auVar64[0xe];
                      local_148[0xf] = (RTCHitN)auVar64[0xf];
                      uStack_124 = local_128;
                      uStack_120 = local_128;
                      uStack_11c = local_128;
                      fStack_114 = local_118;
                      fStack_110 = local_118;
                      fStack_10c = local_118;
                      local_f8 = local_2e8._0_8_;
                      uStack_f0 = local_2e8._8_8_;
                      local_e8 = local_2d8;
                      vpcmpeqd_avx2(ZEXT1632(local_2d8),ZEXT1632(local_2d8));
                      uStack_d4 = context->user->instID[0];
                      local_d8 = uStack_d4;
                      uStack_d0 = uStack_d4;
                      uStack_cc = uStack_d4;
                      uStack_c8 = context->user->instPrimID[0];
                      uStack_c4 = uStack_c8;
                      uStack_c0 = uStack_c8;
                      uStack_bc = uStack_c8;
                      *(float *)(ray + k * 4 + 0x80) = fVar215;
                      local_3a8 = local_2f8._0_8_;
                      uStack_3a0 = local_2f8._8_8_;
                      local_388.valid = (int *)&local_3a8;
                      local_388.geometryUserPtr = pGVar7->userPtr;
                      local_388.context = context->user;
                      local_388.hit = local_148;
                      local_388.N = 4;
                      local_388.ray = (RTCRayN *)ray;
                      if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        local_398 = uVar35;
                        (*pGVar7->intersectionFilterN)(&local_388);
                        auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                        auVar257 = ZEXT3264(auVar75);
                        auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar260 = ZEXT1664(auVar62);
                        auVar259 = ZEXT464(0x3f800000);
                        auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                        auVar261 = ZEXT1664(auVar62);
                        auVar46 = vxorps_avx512vl(auVar46,auVar46);
                        auVar256 = ZEXT1664(auVar46);
                        uVar35 = local_398;
                      }
                      auVar46 = auVar256._0_16_;
                      auVar31._8_8_ = uStack_3a0;
                      auVar31._0_8_ = local_3a8;
                      uVar44 = vptestmd_avx512vl(auVar31,auVar31);
                      if ((uVar44 & 0xf) == 0) {
LAB_01ebe85c:
                        *(float *)(ray + k * 4 + 0x80) = fVar217;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_388);
                          auVar75 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                          auVar257 = ZEXT3264(auVar75);
                          auVar62 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar260 = ZEXT1664(auVar62);
                          auVar259 = ZEXT464(0x3f800000);
                          auVar62 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
                          auVar261 = ZEXT1664(auVar62);
                          auVar46 = vxorps_avx512vl(auVar46,auVar46);
                          auVar256 = ZEXT1664(auVar46);
                        }
                        auVar32._8_8_ = uStack_3a0;
                        auVar32._0_8_ = local_3a8;
                        uVar44 = vptestmd_avx512vl(auVar32,auVar32);
                        uVar44 = uVar44 & 0xf;
                        bVar33 = (byte)uVar44;
                        if (bVar33 == 0) goto LAB_01ebe85c;
                        iVar104 = *(int *)(local_388.hit + 4);
                        iVar255 = *(int *)(local_388.hit + 8);
                        iVar30 = *(int *)(local_388.hit + 0xc);
                        bVar16 = (bool)((byte)(uVar44 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                        bVar14 = SUB81(uVar44 >> 3,0);
                        *(uint *)(local_388.ray + 0xc0) =
                             (uint)(bVar33 & 1) * *(int *)local_388.hit |
                             (uint)!(bool)(bVar33 & 1) * *(int *)(local_388.ray + 0xc0);
                        *(uint *)(local_388.ray + 0xc4) =
                             (uint)bVar16 * iVar104 | (uint)!bVar16 * *(int *)(local_388.ray + 0xc4)
                        ;
                        *(uint *)(local_388.ray + 200) =
                             (uint)bVar13 * iVar255 | (uint)!bVar13 * *(int *)(local_388.ray + 200);
                        *(uint *)(local_388.ray + 0xcc) =
                             (uint)bVar14 * iVar30 | (uint)!bVar14 * *(int *)(local_388.ray + 0xcc);
                        iVar104 = *(int *)(local_388.hit + 0x14);
                        iVar255 = *(int *)(local_388.hit + 0x18);
                        iVar30 = *(int *)(local_388.hit + 0x1c);
                        bVar16 = (bool)((byte)(uVar44 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                        bVar14 = SUB81(uVar44 >> 3,0);
                        *(uint *)(local_388.ray + 0xd0) =
                             (uint)(bVar33 & 1) * *(int *)(local_388.hit + 0x10) |
                             (uint)!(bool)(bVar33 & 1) * *(int *)(local_388.ray + 0xd0);
                        *(uint *)(local_388.ray + 0xd4) =
                             (uint)bVar16 * iVar104 | (uint)!bVar16 * *(int *)(local_388.ray + 0xd4)
                        ;
                        *(uint *)(local_388.ray + 0xd8) =
                             (uint)bVar13 * iVar255 | (uint)!bVar13 * *(int *)(local_388.ray + 0xd8)
                        ;
                        *(uint *)(local_388.ray + 0xdc) =
                             (uint)bVar14 * iVar30 | (uint)!bVar14 * *(int *)(local_388.ray + 0xdc);
                        iVar104 = *(int *)(local_388.hit + 0x24);
                        iVar255 = *(int *)(local_388.hit + 0x28);
                        iVar30 = *(int *)(local_388.hit + 0x2c);
                        bVar16 = (bool)((byte)(uVar44 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                        bVar14 = SUB81(uVar44 >> 3,0);
                        *(uint *)(local_388.ray + 0xe0) =
                             (uint)(bVar33 & 1) * *(int *)(local_388.hit + 0x20) |
                             (uint)!(bool)(bVar33 & 1) * *(int *)(local_388.ray + 0xe0);
                        *(uint *)(local_388.ray + 0xe4) =
                             (uint)bVar16 * iVar104 | (uint)!bVar16 * *(int *)(local_388.ray + 0xe4)
                        ;
                        *(uint *)(local_388.ray + 0xe8) =
                             (uint)bVar13 * iVar255 | (uint)!bVar13 * *(int *)(local_388.ray + 0xe8)
                        ;
                        *(uint *)(local_388.ray + 0xec) =
                             (uint)bVar14 * iVar30 | (uint)!bVar14 * *(int *)(local_388.ray + 0xec);
                        iVar104 = *(int *)(local_388.hit + 0x34);
                        iVar255 = *(int *)(local_388.hit + 0x38);
                        iVar30 = *(int *)(local_388.hit + 0x3c);
                        bVar16 = (bool)((byte)(uVar44 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                        bVar14 = SUB81(uVar44 >> 3,0);
                        *(uint *)(local_388.ray + 0xf0) =
                             (uint)(bVar33 & 1) * *(int *)(local_388.hit + 0x30) |
                             (uint)!(bool)(bVar33 & 1) * *(int *)(local_388.ray + 0xf0);
                        *(uint *)(local_388.ray + 0xf4) =
                             (uint)bVar16 * iVar104 | (uint)!bVar16 * *(int *)(local_388.ray + 0xf4)
                        ;
                        *(uint *)(local_388.ray + 0xf8) =
                             (uint)bVar13 * iVar255 | (uint)!bVar13 * *(int *)(local_388.ray + 0xf8)
                        ;
                        *(uint *)(local_388.ray + 0xfc) =
                             (uint)bVar14 * iVar30 | (uint)!bVar14 * *(int *)(local_388.ray + 0xfc);
                        iVar104 = *(int *)(local_388.hit + 0x44);
                        iVar255 = *(int *)(local_388.hit + 0x48);
                        iVar30 = *(int *)(local_388.hit + 0x4c);
                        bVar16 = (bool)((byte)(uVar44 >> 1) & 1);
                        bVar13 = (bool)((byte)(uVar44 >> 2) & 1);
                        bVar14 = SUB81(uVar44 >> 3,0);
                        *(uint *)(local_388.ray + 0x100) =
                             (uint)(bVar33 & 1) * *(int *)(local_388.hit + 0x40) |
                             (uint)!(bool)(bVar33 & 1) * *(int *)(local_388.ray + 0x100);
                        *(uint *)(local_388.ray + 0x104) =
                             (uint)bVar16 * iVar104 |
                             (uint)!bVar16 * *(int *)(local_388.ray + 0x104);
                        *(uint *)(local_388.ray + 0x108) =
                             (uint)bVar13 * iVar255 |
                             (uint)!bVar13 * *(int *)(local_388.ray + 0x108);
                        *(uint *)(local_388.ray + 0x10c) =
                             (uint)bVar14 * iVar30 | (uint)!bVar14 * *(int *)(local_388.ray + 0x10c)
                        ;
                        auVar46 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_388.hit + 0x50));
                        *(undefined1 (*) [16])(local_388.ray + 0x110) = auVar46;
                        auVar46 = vmovdqu32_avx512vl(*(undefined1 (*) [16])(local_388.hit + 0x60));
                        *(undefined1 (*) [16])(local_388.ray + 0x120) = auVar46;
                        auVar46 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_388.hit + 0x70));
                        *(undefined1 (*) [16])(local_388.ray + 0x130) = auVar46;
                        auVar46 = vmovdqa32_avx512vl(*(undefined1 (*) [16])(local_388.hit + 0x80));
                        *(undefined1 (*) [16])(local_388.ray + 0x140) = auVar46;
                      }
                      auVar233 = ZEXT1664(auVar47);
                      auVar46 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar258 = ZEXT1664(auVar46);
                    }
                    break;
                  }
                }
                auVar233 = ZEXT1664(auVar47);
                break;
              }
              lVar40 = lVar40 + -1;
            } while (lVar40 != 0);
          }
        }
      }
    } while (bVar15);
    auVar46 = vinsertps_avx512f(auVar59,auVar58,0x10);
    auVar75 = vbroadcastss_avx512vl(ZEXT416(3));
  } while( true );
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }